

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  Geometry *pGVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  byte bVar45;
  undefined8 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar56;
  RayHitK<4> *pRVar57;
  undefined4 uVar58;
  AABBNodeMB4D *node1;
  long lVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  long lVar63;
  RTCRayN *pRVar64;
  RTCIntersectArguments *pRVar65;
  ulong uVar66;
  ulong uVar67;
  long lVar68;
  long lVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  ulong uVar73;
  long lVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  byte bVar79;
  byte bVar107;
  byte bVar108;
  float fVar80;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  byte bVar109;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar102;
  undefined1 auVar103 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar104;
  undefined1 auVar105 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar106;
  float fVar113;
  float fVar114;
  uint uVar115;
  uint uVar140;
  uint uVar141;
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  uint uVar142;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  uint uVar145;
  uint uVar155;
  uint uVar156;
  vint4 ai_2;
  undefined1 auVar146 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar147;
  uint uVar157;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  uint uVar160;
  float fVar161;
  uint uVar175;
  uint uVar177;
  vint4 bi;
  float fVar159;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  uint uVar178;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar176;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  vint4 ai_5;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar190;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar191;
  float fVar200;
  float fVar203;
  vint4 ai_1;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar207;
  uint uVar208;
  float fVar209;
  float fVar216;
  uint uVar219;
  vint4 bi_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  uint uVar217;
  float fVar218;
  float fVar220;
  uint uVar221;
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar233;
  float fVar237;
  vint4 ai_7;
  float fVar224;
  float fVar242;
  undefined1 auVar227 [16];
  float fVar234;
  float fVar238;
  float fVar243;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar235;
  float fVar236;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar244;
  float fVar245;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar250 [16];
  float fVar255;
  float fVar259;
  float fVar263;
  undefined1 auVar251 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar280 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<4>_> *local_1460;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined1 local_1438 [12];
  float fStack_142c;
  undefined8 local_1418;
  float fStack_1410;
  float fStack_140c;
  vbool<4> valid;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  long local_13e8;
  long local_13e0;
  ulong local_13d8;
  ulong local_13d0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1378;
  undefined8 uStack_1370;
  vfloat<4> tNear;
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  float local_12a8 [4];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  int local_1228;
  int iStack_1224;
  int iStack_1220;
  int iStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  long local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  long local_1198;
  ulong local_1190;
  RayHitK<4> *local_1188;
  Scene *local_1180;
  long local_1178;
  ulong local_1170;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  vint4 bi_2;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  uint local_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_1460 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1158 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1238 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1248 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1168 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar113 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar143 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar158 = local_1168 * 0.99999964;
  fVar159 = fVar113 * 0.99999964;
  fVar80 = fVar143 * 0.99999964;
  local_1168 = local_1168 * 1.0000004;
  fVar113 = fVar113 * 1.0000004;
  fVar143 = fVar143 * 1.0000004;
  local_11a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_11b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11b8 = local_11a0 ^ 0x10;
  local_11c0 = local_11a8 ^ 0x10;
  local_11c8 = local_11b0 ^ 0x10;
  bi_2.field_0.i[0] = *(int *)((long)&(tray->tnear).field_0 + k * 4);
  bi_2.field_0.i[1] = bi_2.field_0.i[0];
  bi_2.field_0.i[2] = bi_2.field_0.i[0];
  bi_2.field_0.i[3] = bi_2.field_0.i[0];
  local_1228 = (tray->tfar).field_0.i[k];
  iStack_1224 = local_1228;
  iStack_1220 = local_1228;
  iStack_121c = local_1228;
  lVar59 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1244 = local_1248;
  fStack_1240 = local_1248;
  fStack_123c = local_1248;
  local_1188 = ray;
  fStack_1154 = local_1158;
  fStack_1150 = local_1158;
  fStack_114c = local_1158;
  fStack_1164 = local_1168;
  fStack_1160 = local_1168;
  fStack_115c = local_1168;
  fVar176 = local_1168;
  fVar161 = local_1168;
  fVar246 = local_1168;
  fVar252 = local_1168;
  fVar256 = local_1158;
  fVar144 = local_1158;
  fVar223 = local_1158;
  fVar233 = local_1158;
  fVar244 = local_1248;
  fVar239 = local_1248;
  fVar216 = local_1248;
  fVar207 = local_1248;
  fVar114 = local_1238;
  fVar263 = local_1238;
  fVar243 = local_1238;
  fVar261 = local_1238;
  while (local_1460 != stack) {
    pSVar56 = local_1460 + -1;
    local_1460 = local_1460 + -1;
    if ((float)pSVar56->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar56->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar67 = (local_1460->ptr).ptr;
      do {
        if ((uVar67 & 8) == 0) {
          uVar60 = uVar67 & 0xfffffffffffffff0;
          fVar237 = *(float *)(ray + k * 4 + 0x70);
          pfVar13 = (float *)(uVar60 + 0x80 + local_11a0);
          pfVar12 = (float *)(uVar60 + 0x20 + local_11a0);
          auVar195._0_4_ = ((*pfVar13 * fVar237 + *pfVar12) - fVar233) * fVar158;
          auVar195._4_4_ = ((pfVar13[1] * fVar237 + pfVar12[1]) - fVar223) * fVar158;
          auVar195._8_4_ = ((pfVar13[2] * fVar237 + pfVar12[2]) - fVar144) * fVar158;
          auVar195._12_4_ = ((pfVar13[3] * fVar237 + pfVar12[3]) - fVar256) * fVar158;
          pfVar14 = (float *)(uVar60 + 0x80 + local_11a8);
          pfVar12 = (float *)(uVar60 + 0x20 + local_11a8);
          pfVar15 = (float *)(uVar60 + 0x80 + local_11b0);
          pfVar13 = (float *)(uVar60 + 0x20 + local_11b0);
          auVar230._0_4_ = ((*pfVar14 * fVar237 + *pfVar12) - fVar261) * fVar159;
          auVar230._4_4_ = ((pfVar14[1] * fVar237 + pfVar12[1]) - fVar243) * fVar159;
          auVar230._8_4_ = ((pfVar14[2] * fVar237 + pfVar12[2]) - fVar263) * fVar159;
          auVar230._12_4_ = ((pfVar14[3] * fVar237 + pfVar12[3]) - fVar114) * fVar159;
          auVar162._0_4_ = ((*pfVar15 * fVar237 + *pfVar13) - fVar207) * fVar80;
          auVar162._4_4_ = ((pfVar15[1] * fVar237 + pfVar13[1]) - fVar216) * fVar80;
          auVar162._8_4_ = ((pfVar15[2] * fVar237 + pfVar13[2]) - fVar239) * fVar80;
          auVar162._12_4_ = ((pfVar15[3] * fVar237 + pfVar13[3]) - fVar244) * fVar80;
          auVar162 = maxps(auVar230,auVar162);
          auVar180._4_4_ = bi_2.field_0.i[1];
          auVar180._0_4_ = bi_2.field_0.i[0];
          auVar180._8_4_ = bi_2.field_0.i[2];
          auVar180._12_4_ = bi_2.field_0.i[3];
          auVar116 = maxps(auVar180,auVar195);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar116,auVar162);
          pfVar14 = (float *)(uVar60 + 0x80 + local_11b8);
          pfVar12 = (float *)(uVar60 + 0x20 + local_11b8);
          pfVar15 = (float *)(uVar60 + 0x80 + local_11c0);
          pfVar13 = (float *)(uVar60 + 0x20 + local_11c0);
          auVar163._0_4_ = ((*pfVar14 * fVar237 + *pfVar12) - fVar233) * fVar252;
          auVar163._4_4_ = ((pfVar14[1] * fVar237 + pfVar12[1]) - fVar223) * fVar246;
          auVar163._8_4_ = ((pfVar14[2] * fVar237 + pfVar12[2]) - fVar144) * fVar161;
          auVar163._12_4_ = ((pfVar14[3] * fVar237 + pfVar12[3]) - fVar256) * fVar176;
          auVar179._0_4_ = ((*pfVar15 * fVar237 + *pfVar13) - fVar261) * fVar113;
          auVar179._4_4_ = ((pfVar15[1] * fVar237 + pfVar13[1]) - fVar243) * fVar113;
          auVar179._8_4_ = ((pfVar15[2] * fVar237 + pfVar13[2]) - fVar263) * fVar113;
          auVar179._12_4_ = ((pfVar15[3] * fVar237 + pfVar13[3]) - fVar114) * fVar113;
          pfVar13 = (float *)(uVar60 + 0x80 + local_11c8);
          pfVar12 = (float *)(uVar60 + 0x20 + local_11c8);
          auVar211._0_4_ = ((*pfVar13 * fVar237 + *pfVar12) - fVar207) * fVar143;
          auVar211._4_4_ = ((pfVar13[1] * fVar237 + pfVar12[1]) - fVar216) * fVar143;
          auVar211._8_4_ = ((pfVar13[2] * fVar237 + pfVar12[2]) - fVar239) * fVar143;
          auVar211._12_4_ = ((pfVar13[3] * fVar237 + pfVar12[3]) - fVar244) * fVar143;
          auVar180 = minps(auVar179,auVar211);
          auVar116._4_4_ = iStack_1224;
          auVar116._0_4_ = local_1228;
          auVar116._8_4_ = iStack_1220;
          auVar116._12_4_ = iStack_121c;
          auVar116 = minps(auVar116,auVar163);
          auVar116 = minps(auVar116,auVar180);
          if (((uint)uVar67 & 7) == 6) {
            bVar27 = (fVar237 < *(float *)(uVar60 + 0xf0) && *(float *)(uVar60 + 0xe0) <= fVar237)
                     && tNear.field_0._0_4_ <= auVar116._0_4_;
            bVar28 = (fVar237 < *(float *)(uVar60 + 0xf4) && *(float *)(uVar60 + 0xe4) <= fVar237)
                     && tNear.field_0._4_4_ <= auVar116._4_4_;
            bVar29 = (fVar237 < *(float *)(uVar60 + 0xf8) && *(float *)(uVar60 + 0xe8) <= fVar237)
                     && tNear.field_0._8_4_ <= auVar116._8_4_;
            bVar30 = (fVar237 < *(float *)(uVar60 + 0xfc) && *(float *)(uVar60 + 0xec) <= fVar237)
                     && tNear.field_0._12_4_ <= auVar116._12_4_;
          }
          else {
            bVar27 = tNear.field_0._0_4_ <= auVar116._0_4_;
            bVar28 = tNear.field_0._4_4_ <= auVar116._4_4_;
            bVar29 = tNear.field_0._8_4_ <= auVar116._8_4_;
            bVar30 = tNear.field_0._12_4_ <= auVar116._12_4_;
          }
          auVar81._0_4_ = (uint)bVar27 * -0x80000000;
          auVar81._4_4_ = (uint)bVar28 * -0x80000000;
          auVar81._8_4_ = (uint)bVar29 * -0x80000000;
          auVar81._12_4_ = (uint)bVar30 * -0x80000000;
          uVar58 = movmskps((int)uVar60,auVar81);
          local_1190 = CONCAT44((int)(uVar60 >> 0x20),uVar58);
        }
        if ((uVar67 & 8) == 0) {
          if (local_1190 == 0) {
            iVar75 = 4;
          }
          else {
            uVar60 = uVar67 & 0xfffffffffffffff0;
            lVar74 = 0;
            if (local_1190 != 0) {
              for (; (local_1190 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
              }
            }
            iVar75 = 0;
            uVar67 = *(ulong *)(uVar60 + lVar74 * 8);
            uVar70 = local_1190 - 1 & local_1190;
            if (uVar70 != 0) {
              uVar115 = tNear.field_0.i[lVar74];
              lVar74 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                }
              }
              uVar66 = *(ulong *)(uVar60 + lVar74 * 8);
              uVar140 = tNear.field_0.i[lVar74];
              uVar70 = uVar70 - 1 & uVar70;
              if (uVar70 == 0) {
                if (uVar115 < uVar140) {
                  (local_1460->ptr).ptr = uVar66;
                  local_1460->dist = uVar140;
                  local_1460 = local_1460 + 1;
                }
                else {
                  (local_1460->ptr).ptr = uVar67;
                  local_1460->dist = uVar115;
                  uVar67 = uVar66;
                  local_1460 = local_1460 + 1;
                }
              }
              else {
                auVar117._8_4_ = uVar115;
                auVar117._0_8_ = uVar67;
                auVar117._12_4_ = 0;
                auVar164._8_4_ = uVar140;
                auVar164._0_8_ = uVar66;
                auVar164._12_4_ = 0;
                lVar74 = 0;
                if (uVar70 != 0) {
                  for (; (uVar70 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                  }
                }
                uVar21 = *(undefined8 *)(uVar60 + lVar74 * 8);
                iVar76 = tNear.field_0.i[lVar74];
                auVar146._8_4_ = iVar76;
                auVar146._0_8_ = uVar21;
                auVar146._12_4_ = 0;
                auVar82._8_4_ = -(uint)((int)uVar115 < (int)uVar140);
                uVar70 = uVar70 - 1 & uVar70;
                if (uVar70 == 0) {
                  auVar82._4_4_ = auVar82._8_4_;
                  auVar82._0_4_ = auVar82._8_4_;
                  auVar82._12_4_ = auVar82._8_4_;
                  auVar181._8_4_ = uVar140;
                  auVar181._0_8_ = uVar66;
                  auVar181._12_4_ = 0;
                  auVar162 = blendvps(auVar181,auVar117,auVar82);
                  auVar116 = blendvps(auVar117,auVar164,auVar82);
                  auVar83._8_4_ = -(uint)(auVar162._8_4_ < iVar76);
                  auVar83._4_4_ = auVar83._8_4_;
                  auVar83._0_4_ = auVar83._8_4_;
                  auVar83._12_4_ = auVar83._8_4_;
                  auVar165._8_4_ = iVar76;
                  auVar165._0_8_ = uVar21;
                  auVar165._12_4_ = 0;
                  auVar180 = blendvps(auVar165,auVar162,auVar83);
                  auVar162 = blendvps(auVar162,auVar146,auVar83);
                  auVar84._8_4_ = -(uint)(auVar116._8_4_ < auVar162._8_4_);
                  auVar84._4_4_ = auVar84._8_4_;
                  auVar84._0_4_ = auVar84._8_4_;
                  auVar84._12_4_ = auVar84._8_4_;
                  SVar147 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar162,auVar116,auVar84);
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar116,auVar162,auVar84);
                  *local_1460 = SVar118;
                  local_1460[1] = SVar147;
                  uVar67 = auVar180._0_8_;
                  local_1460 = local_1460 + 2;
                }
                else {
                  lVar74 = 0;
                  if (uVar70 != 0) {
                    for (; (uVar70 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                    }
                  }
                  auVar85._4_4_ = auVar82._8_4_;
                  auVar85._0_4_ = auVar82._8_4_;
                  auVar85._8_4_ = auVar82._8_4_;
                  auVar85._12_4_ = auVar82._8_4_;
                  auVar195 = blendvps(auVar164,auVar117,auVar85);
                  auVar116 = blendvps(auVar117,auVar164,auVar85);
                  auVar192._8_4_ = tNear.field_0.i[lVar74];
                  auVar192._0_8_ = *(undefined8 *)(uVar60 + lVar74 * 8);
                  auVar192._12_4_ = 0;
                  auVar86._8_4_ = -(uint)(iVar76 < tNear.field_0.i[lVar74]);
                  auVar86._4_4_ = auVar86._8_4_;
                  auVar86._0_4_ = auVar86._8_4_;
                  auVar86._12_4_ = auVar86._8_4_;
                  auVar162 = blendvps(auVar192,auVar146,auVar86);
                  auVar180 = blendvps(auVar146,auVar192,auVar86);
                  auVar87._8_4_ = -(uint)(auVar116._8_4_ < auVar180._8_4_);
                  auVar87._4_4_ = auVar87._8_4_;
                  auVar87._0_4_ = auVar87._8_4_;
                  auVar87._12_4_ = auVar87._8_4_;
                  auVar211 = blendvps(auVar180,auVar116,auVar87);
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar116,auVar180,auVar87);
                  auVar88._8_4_ = -(uint)(auVar195._8_4_ < auVar162._8_4_);
                  auVar88._4_4_ = auVar88._8_4_;
                  auVar88._0_4_ = auVar88._8_4_;
                  auVar88._12_4_ = auVar88._8_4_;
                  auVar116 = blendvps(auVar162,auVar195,auVar88);
                  auVar180 = blendvps(auVar195,auVar162,auVar88);
                  auVar89._8_4_ = -(uint)(auVar180._8_4_ < auVar211._8_4_);
                  auVar89._4_4_ = auVar89._8_4_;
                  auVar89._0_4_ = auVar89._8_4_;
                  auVar89._12_4_ = auVar89._8_4_;
                  SVar147 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar211,auVar180,auVar89);
                  SVar182 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar180,auVar211,auVar89);
                  *local_1460 = SVar118;
                  local_1460[1] = SVar182;
                  local_1460[2] = SVar147;
                  uVar67 = auVar116._0_8_;
                  local_1460 = local_1460 + 3;
                  fVar261 = local_1238;
                  fVar243 = fStack_1234;
                  fVar263 = fStack_1230;
                  fVar114 = fStack_122c;
                  fVar207 = local_1248;
                  fVar216 = fStack_1244;
                  fVar239 = fStack_1240;
                  fVar244 = fStack_123c;
                }
              }
            }
          }
        }
        else {
          iVar75 = 6;
        }
      } while (iVar75 == 0);
      if (iVar75 == 6) {
        local_11d0 = (ulong)((uint)uVar67 & 0xf) - 8;
        if (local_11d0 != 0) {
          uVar67 = uVar67 & 0xfffffffffffffff0;
          local_1198 = 0;
          do {
            local_13e8 = local_1198 * 0x90;
            fVar144 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar67 + 0x80 + local_13e8)) *
                      *(float *)(uVar67 + 0x84 + local_13e8);
            uVar60 = *(ulong *)(uVar67 + 0x20 + local_13e8);
            auVar119._8_8_ = 0;
            auVar119._0_8_ = uVar60;
            uVar70 = *(ulong *)(uVar67 + 0x24 + local_13e8);
            auVar166._8_8_ = 0;
            auVar166._0_8_ = uVar70;
            bVar31 = (byte)uVar70;
            bVar79 = (byte)uVar60;
            bVar32 = (byte)(uVar70 >> 8);
            bVar107 = (byte)(uVar60 >> 8);
            bVar33 = (byte)(uVar70 >> 0x10);
            bVar108 = (byte)(uVar60 >> 0x10);
            bVar34 = (byte)(uVar70 >> 0x18);
            bVar109 = (byte)(uVar60 >> 0x18);
            bVar35 = (byte)(uVar70 >> 0x20);
            bVar110 = (byte)(uVar60 >> 0x20);
            bVar36 = (byte)(uVar70 >> 0x28);
            bVar111 = (byte)(uVar60 >> 0x28);
            bVar37 = (byte)(uVar70 >> 0x30);
            bVar112 = (byte)(uVar60 >> 0x30);
            bVar45 = (byte)(uVar60 >> 0x38);
            bVar38 = (byte)(uVar70 >> 0x38);
            auVar90[0] = -((byte)((bVar31 < bVar79) * bVar31 | (bVar31 >= bVar79) * bVar79) ==
                          bVar79);
            auVar90[1] = -((byte)((bVar32 < bVar107) * bVar32 | (bVar32 >= bVar107) * bVar107) ==
                          bVar107);
            auVar90[2] = -((byte)((bVar33 < bVar108) * bVar33 | (bVar33 >= bVar108) * bVar108) ==
                          bVar108);
            auVar90[3] = -((byte)((bVar34 < bVar109) * bVar34 | (bVar34 >= bVar109) * bVar109) ==
                          bVar109);
            auVar90[4] = -((byte)((bVar35 < bVar110) * bVar35 | (bVar35 >= bVar110) * bVar110) ==
                          bVar110);
            auVar90[5] = -((byte)((bVar36 < bVar111) * bVar36 | (bVar36 >= bVar111) * bVar111) ==
                          bVar111);
            auVar90[6] = -((byte)((bVar37 < bVar112) * bVar37 | (bVar37 >= bVar112) * bVar112) ==
                          bVar112);
            auVar90[7] = -((byte)((bVar38 < bVar45) * bVar38 | (bVar38 >= bVar45) * bVar45) ==
                          bVar45);
            auVar90[8] = 0xff;
            auVar90[9] = 0xff;
            auVar90[10] = 0xff;
            auVar90[0xb] = 0xff;
            auVar90[0xc] = 0xff;
            auVar90[0xd] = 0xff;
            auVar90[0xe] = 0xff;
            auVar90[0xf] = 0xff;
            auVar116 = pmovzxbd(auVar119,auVar119);
            fVar261 = *(float *)(uVar67 + 0x38 + local_13e8);
            fVar243 = *(float *)(uVar67 + 0x3c + local_13e8);
            fVar263 = *(float *)(uVar67 + 0x40 + local_13e8);
            fVar114 = *(float *)(uVar67 + 0x44 + local_13e8);
            fVar246 = (float)auVar116._0_4_ * fVar114 + fVar261;
            fVar252 = (float)auVar116._4_4_ * fVar114 + fVar261;
            fVar256 = (float)auVar116._8_4_ * fVar114 + fVar261;
            fVar260 = (float)auVar116._12_4_ * fVar114 + fVar261;
            auVar120._8_8_ = 0;
            auVar120._0_8_ = *(ulong *)(uVar67 + 0x50 + local_13e8);
            auVar116 = pmovzxbd(auVar120,auVar120);
            fVar207 = *(float *)(uVar67 + 0x74 + local_13e8);
            fVar216 = *(float *)(uVar67 + 0x68 + local_13e8);
            auVar180 = pmovzxbd(auVar166,auVar166);
            fVar247 = (float)auVar180._0_4_ * fVar114 + fVar261;
            fVar253 = (float)auVar180._4_4_ * fVar114 + fVar261;
            fVar257 = (float)auVar180._8_4_ * fVar114 + fVar261;
            fVar261 = (float)auVar180._12_4_ * fVar114 + fVar261;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(uVar67 + 0x54 + local_13e8);
            auVar180 = pmovzxbd(auVar167,auVar167);
            auVar193._8_8_ = 0;
            auVar193._0_8_ = *(ulong *)(uVar67 + 0x28 + local_13e8);
            auVar162 = pmovzxbd(auVar193,auVar193);
            fVar114 = *(float *)(uVar67 + 0x48 + local_13e8);
            fVar223 = (float)auVar162._0_4_ * fVar114 + fVar243;
            fVar233 = (float)auVar162._4_4_ * fVar114 + fVar243;
            fVar237 = (float)auVar162._8_4_ * fVar114 + fVar243;
            fVar242 = (float)auVar162._12_4_ * fVar114 + fVar243;
            auVar194._8_8_ = 0;
            auVar194._0_8_ = *(ulong *)(uVar67 + 0x58 + local_13e8);
            auVar195 = pmovzxbd(auVar194,auVar194);
            fVar239 = *(float *)(uVar67 + 0x78 + local_13e8);
            fVar244 = *(float *)(uVar67 + 0x6c + local_13e8);
            auVar227._8_8_ = 0;
            auVar227._0_8_ = *(ulong *)(uVar67 + 0x2c + local_13e8);
            auVar162 = pmovzxbd(auVar227,auVar227);
            fVar224 = (float)auVar162._0_4_ * fVar114 + fVar243;
            fVar234 = (float)auVar162._4_4_ * fVar114 + fVar243;
            fVar238 = (float)auVar162._8_4_ * fVar114 + fVar243;
            fVar243 = (float)auVar162._12_4_ * fVar114 + fVar243;
            auVar210._8_8_ = 0;
            auVar210._0_8_ = *(ulong *)(uVar67 + 0x5c + local_13e8);
            auVar211 = pmovzxbd(auVar210,auVar210);
            auVar228._8_8_ = 0;
            auVar228._0_8_ = *(ulong *)(uVar67 + 0x30 + local_13e8);
            auVar162 = pmovzxbd(auVar228,auVar228);
            fVar114 = *(float *)(uVar67 + 0x4c + local_13e8);
            fVar248 = (float)auVar162._0_4_ * fVar114 + fVar263;
            fVar254 = (float)auVar162._4_4_ * fVar114 + fVar263;
            fVar258 = (float)auVar162._8_4_ * fVar114 + fVar263;
            fVar262 = (float)auVar162._12_4_ * fVar114 + fVar263;
            auVar229._8_8_ = 0;
            auVar229._0_8_ = *(ulong *)(uVar67 + 0x60 + local_13e8);
            auVar230 = pmovzxbd(auVar229,auVar229);
            fVar176 = *(float *)(uVar67 + 0x7c + local_13e8);
            fVar161 = *(float *)(uVar67 + 0x70 + local_13e8);
            auVar250._8_8_ = 0;
            auVar250._0_8_ = *(ulong *)(uVar67 + 0x34 + local_13e8);
            auVar162 = pmovzxbd(auVar250,auVar250);
            fVar249 = (float)auVar162._0_4_ * fVar114 + fVar263;
            fVar255 = (float)auVar162._4_4_ * fVar114 + fVar263;
            fVar259 = (float)auVar162._8_4_ * fVar114 + fVar263;
            fVar263 = (float)auVar162._12_4_ * fVar114 + fVar263;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = *(ulong *)(uVar67 + 100 + local_13e8);
            auVar162 = pmovzxbd(auVar183,auVar183);
            fVar114 = (((((float)auVar116._0_4_ * fVar207 + fVar216) - fVar246) * fVar144 + fVar246)
                      - local_1158) * fVar158;
            fVar246 = (((((float)auVar116._4_4_ * fVar207 + fVar216) - fVar252) * fVar144 + fVar252)
                      - fStack_1154) * fVar158;
            fVar252 = (((((float)auVar116._8_4_ * fVar207 + fVar216) - fVar256) * fVar144 + fVar256)
                      - fStack_1150) * fVar158;
            fVar256 = (((((float)auVar116._12_4_ * fVar207 + fVar216) - fVar260) * fVar144 + fVar260
                       ) - fStack_114c) * fVar158;
            fVar260 = (((((float)auVar195._0_4_ * fVar239 + fVar244) - fVar223) * fVar144 + fVar223)
                      - local_1238) * fVar159;
            fVar200 = (((((float)auVar195._4_4_ * fVar239 + fVar244) - fVar233) * fVar144 + fVar233)
                      - fStack_1234) * fVar159;
            fVar203 = (((((float)auVar195._8_4_ * fVar239 + fVar244) - fVar237) * fVar144 + fVar237)
                      - fStack_1230) * fVar159;
            fVar242 = (((((float)auVar195._12_4_ * fVar239 + fVar244) - fVar242) * fVar144 + fVar242
                       ) - fStack_122c) * fVar159;
            fVar223 = (((((float)auVar180._0_4_ * fVar207 + fVar216) - fVar247) * fVar144 + fVar247)
                      - local_1158) * local_1168;
            fVar233 = (((((float)auVar180._4_4_ * fVar207 + fVar216) - fVar253) * fVar144 + fVar253)
                      - fStack_1154) * fStack_1164;
            fVar237 = (((((float)auVar180._8_4_ * fVar207 + fVar216) - fVar257) * fVar144 + fVar257)
                      - fStack_1150) * fStack_1160;
            fVar261 = (((((float)auVar180._12_4_ * fVar207 + fVar216) - fVar261) * fVar144 + fVar261
                       ) - fStack_114c) * fStack_115c;
            fVar207 = (((((float)auVar211._0_4_ * fVar239 + fVar244) - fVar224) * fVar144 + fVar224)
                      - local_1238) * fVar113;
            fVar216 = (((((float)auVar211._4_4_ * fVar239 + fVar244) - fVar234) * fVar144 + fVar234)
                      - fStack_1234) * fVar113;
            fVar224 = (((((float)auVar211._8_4_ * fVar239 + fVar244) - fVar238) * fVar144 + fVar238)
                      - fStack_1230) * fVar113;
            fVar243 = (((((float)auVar211._12_4_ * fVar239 + fVar244) - fVar243) * fVar144 + fVar243
                       ) - fStack_122c) * fVar113;
            uVar145 = (uint)((int)fVar223 < (int)fVar114) * (int)fVar223 |
                      (uint)((int)fVar223 >= (int)fVar114) * (int)fVar114;
            uVar155 = (uint)((int)fVar233 < (int)fVar246) * (int)fVar233 |
                      (uint)((int)fVar233 >= (int)fVar246) * (int)fVar246;
            uVar156 = (uint)((int)fVar237 < (int)fVar252) * (int)fVar237 |
                      (uint)((int)fVar237 >= (int)fVar252) * (int)fVar252;
            uVar157 = (uint)((int)fVar261 < (int)fVar256) * (int)fVar261 |
                      (uint)((int)fVar261 >= (int)fVar256) * (int)fVar256;
            uVar160 = (uint)((int)fVar223 < (int)fVar114) * (int)fVar114 |
                      (uint)((int)fVar223 >= (int)fVar114) * (int)fVar223;
            uVar175 = (uint)((int)fVar233 < (int)fVar246) * (int)fVar246 |
                      (uint)((int)fVar233 >= (int)fVar246) * (int)fVar233;
            uVar177 = (uint)((int)fVar237 < (int)fVar252) * (int)fVar252 |
                      (uint)((int)fVar237 >= (int)fVar252) * (int)fVar237;
            uVar178 = (uint)((int)fVar261 < (int)fVar256) * (int)fVar256 |
                      (uint)((int)fVar261 >= (int)fVar256) * (int)fVar261;
            uVar115 = (uint)((int)fVar207 < (int)fVar260) * (int)fVar207 |
                      (uint)((int)fVar207 >= (int)fVar260) * (int)fVar260;
            uVar140 = (uint)((int)fVar216 < (int)fVar200) * (int)fVar216 |
                      (uint)((int)fVar216 >= (int)fVar200) * (int)fVar200;
            uVar141 = (uint)((int)fVar224 < (int)fVar203) * (int)fVar224 |
                      (uint)((int)fVar224 >= (int)fVar203) * (int)fVar203;
            uVar142 = (uint)((int)fVar243 < (int)fVar242) * (int)fVar243 |
                      (uint)((int)fVar243 >= (int)fVar242) * (int)fVar242;
            uVar115 = ((int)uVar115 < (int)uVar145) * uVar145 |
                      ((int)uVar115 >= (int)uVar145) * uVar115;
            uVar140 = ((int)uVar140 < (int)uVar155) * uVar155 |
                      ((int)uVar140 >= (int)uVar155) * uVar140;
            uVar141 = ((int)uVar141 < (int)uVar156) * uVar156 |
                      ((int)uVar141 >= (int)uVar156) * uVar141;
            uVar142 = ((int)uVar142 < (int)uVar157) * uVar157 |
                      ((int)uVar142 >= (int)uVar157) * uVar142;
            uVar145 = (uint)((int)fVar207 < (int)fVar260) * (int)fVar260 |
                      (uint)((int)fVar207 >= (int)fVar260) * (int)fVar207;
            uVar155 = (uint)((int)fVar216 < (int)fVar200) * (int)fVar200 |
                      (uint)((int)fVar216 >= (int)fVar200) * (int)fVar216;
            uVar156 = (uint)((int)fVar224 < (int)fVar203) * (int)fVar203 |
                      (uint)((int)fVar224 >= (int)fVar203) * (int)fVar224;
            uVar157 = (uint)((int)fVar243 < (int)fVar242) * (int)fVar242 |
                      (uint)((int)fVar243 >= (int)fVar242) * (int)fVar243;
            fVar207 = (((((float)auVar230._0_4_ * fVar176 + fVar161) - fVar248) * fVar144 + fVar248)
                      - local_1248) * fVar80;
            fVar216 = (((((float)auVar230._4_4_ * fVar176 + fVar161) - fVar254) * fVar144 + fVar254)
                      - fStack_1244) * fVar80;
            fVar239 = (((((float)auVar230._8_4_ * fVar176 + fVar161) - fVar258) * fVar144 + fVar258)
                      - fStack_1240) * fVar80;
            fVar244 = (((((float)auVar230._12_4_ * fVar176 + fVar161) - fVar262) * fVar144 + fVar262
                       ) - fStack_123c) * fVar80;
            fVar261 = (((((float)auVar162._0_4_ * fVar176 + fVar161) - fVar249) * fVar144 + fVar249)
                      - local_1248) * fVar143;
            fVar243 = (((((float)auVar162._4_4_ * fVar176 + fVar161) - fVar255) * fVar144 + fVar255)
                      - fStack_1244) * fVar143;
            fVar114 = (((((float)auVar162._8_4_ * fVar176 + fVar161) - fVar259) * fVar144 + fVar259)
                      - fStack_1240) * fVar143;
            fVar263 = (((((float)auVar162._12_4_ * fVar176 + fVar161) - fVar263) * fVar144 + fVar263
                       ) - fStack_123c) * fVar143;
            uVar208 = ((int)uVar160 < (int)uVar145) * uVar160 |
                      ((int)uVar160 >= (int)uVar145) * uVar145;
            uVar217 = ((int)uVar175 < (int)uVar155) * uVar175 |
                      ((int)uVar175 >= (int)uVar155) * uVar155;
            uVar219 = ((int)uVar177 < (int)uVar156) * uVar177 |
                      ((int)uVar177 >= (int)uVar156) * uVar156;
            uVar221 = ((int)uVar178 < (int)uVar157) * uVar178 |
                      ((int)uVar178 >= (int)uVar157) * uVar157;
            uVar145 = (uint)((int)fVar261 < (int)fVar207) * (int)fVar261 |
                      (uint)((int)fVar261 >= (int)fVar207) * (int)fVar207;
            uVar155 = (uint)((int)fVar243 < (int)fVar216) * (int)fVar243 |
                      (uint)((int)fVar243 >= (int)fVar216) * (int)fVar216;
            uVar156 = (uint)((int)fVar114 < (int)fVar239) * (int)fVar114 |
                      (uint)((int)fVar114 >= (int)fVar239) * (int)fVar239;
            uVar157 = (uint)((int)fVar263 < (int)fVar244) * (int)fVar263 |
                      (uint)((int)fVar263 >= (int)fVar244) * (int)fVar244;
            uVar160 = (uint)((int)fVar261 < (int)fVar207) * (int)fVar207 |
                      (uint)((int)fVar261 >= (int)fVar207) * (int)fVar261;
            uVar175 = (uint)((int)fVar243 < (int)fVar216) * (int)fVar216 |
                      (uint)((int)fVar243 >= (int)fVar216) * (int)fVar243;
            uVar177 = (uint)((int)fVar114 < (int)fVar239) * (int)fVar239 |
                      (uint)((int)fVar114 >= (int)fVar239) * (int)fVar114;
            uVar178 = (uint)((int)fVar263 < (int)fVar244) * (int)fVar244 |
                      (uint)((int)fVar263 >= (int)fVar244) * (int)fVar263;
            uVar145 = (uint)((int)uVar145 < bi_2.field_0.i[0]) * bi_2.field_0.i[0] |
                      ((int)uVar145 >= bi_2.field_0.i[0]) * uVar145;
            uVar155 = (uint)((int)uVar155 < bi_2.field_0.i[1]) * bi_2.field_0.i[1] |
                      ((int)uVar155 >= bi_2.field_0.i[1]) * uVar155;
            uVar156 = (uint)((int)uVar156 < bi_2.field_0.i[2]) * bi_2.field_0.i[2] |
                      ((int)uVar156 >= bi_2.field_0.i[2]) * uVar156;
            uVar157 = (uint)((int)uVar157 < bi_2.field_0.i[3]) * bi_2.field_0.i[3] |
                      ((int)uVar157 >= bi_2.field_0.i[3]) * uVar157;
            dist.field_0.i[0] =
                 ((int)uVar145 < (int)uVar115) * uVar115 | ((int)uVar145 >= (int)uVar115) * uVar145;
            dist.field_0.i[1] =
                 ((int)uVar155 < (int)uVar140) * uVar140 | ((int)uVar155 >= (int)uVar140) * uVar155;
            dist.field_0.i[2] =
                 ((int)uVar156 < (int)uVar141) * uVar141 | ((int)uVar156 >= (int)uVar141) * uVar156;
            dist.field_0.i[3] =
                 ((int)uVar157 < (int)uVar142) * uVar142 | ((int)uVar157 >= (int)uVar142) * uVar157;
            uVar115 = (uint)(local_1228 < (int)uVar160) * local_1228 |
                      (local_1228 >= (int)uVar160) * uVar160;
            uVar140 = (uint)(iStack_1224 < (int)uVar175) * iStack_1224 |
                      (iStack_1224 >= (int)uVar175) * uVar175;
            uVar141 = (uint)(iStack_1220 < (int)uVar177) * iStack_1220 |
                      (iStack_1220 >= (int)uVar177) * uVar177;
            uVar142 = (uint)(iStack_121c < (int)uVar178) * iStack_121c |
                      (iStack_121c >= (int)uVar178) * uVar178;
            auVar148._0_4_ =
                 -(uint)((int)(((int)uVar208 < (int)uVar115) * uVar208 |
                              ((int)uVar208 >= (int)uVar115) * uVar115) < dist.field_0.i[0]);
            auVar148._4_4_ =
                 -(uint)((int)(((int)uVar217 < (int)uVar140) * uVar217 |
                              ((int)uVar217 >= (int)uVar140) * uVar140) < dist.field_0.i[1]);
            auVar148._8_4_ =
                 -(uint)((int)(((int)uVar219 < (int)uVar141) * uVar219 |
                              ((int)uVar219 >= (int)uVar141) * uVar141) < dist.field_0.i[2]);
            auVar148._12_4_ =
                 -(uint)((int)(((int)uVar221 < (int)uVar142) * uVar221 |
                              ((int)uVar221 >= (int)uVar142) * uVar142) < dist.field_0.i[3]);
            auVar116 = pmovsxbd(auVar90,auVar90);
            uVar115 = movmskps((int)local_13e8,~auVar148 & auVar116);
            if (uVar115 != 0) {
              local_13e8 = local_13e8 + uVar67;
              local_1170 = (ulong)(uVar115 & 0xff);
              do {
                pRVar57 = local_1188;
                lVar74 = 0;
                if (local_1170 != 0) {
                  for (; (local_1170 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                  }
                }
                fVar261 = *(float *)(ray + k * 4 + 0x80);
                if (dist.field_0.v[lVar74] <= fVar261) {
                  uVar18 = *(ushort *)(local_13e8 + lVar74 * 8);
                  uVar19 = *(ushort *)(local_13e8 + 2 + lVar74 * 8);
                  uStack_1440._0_4_ = *(uint *)(local_13e8 + 0x88);
                  uVar60 = (ulong)(uint)uStack_1440;
                  fVar114 = *(float *)(local_13e8 + 4 + lVar74 * 8);
                  uVar70 = (ulong)(uint)fVar114;
                  local_1180 = context->scene;
                  pGVar22 = (local_1180->geometries).items[uVar60].ptr;
                  lVar71 = *(long *)&pGVar22->field_0x58;
                  lVar61 = uVar70 * pGVar22[1].super_RefCount.refCounter.
                                    super___atomic_base<unsigned_long>._M_i;
                  fVar243 = pGVar22->fnumTimeSegments;
                  fVar263 = (pGVar22->time_range).lower;
                  auVar149._0_4_ = (pGVar22->time_range).upper - fVar263;
                  auVar121._4_4_ = fVar263;
                  auVar121._0_4_ = fVar263;
                  auVar121._8_4_ = fVar263;
                  auVar121._12_4_ = fVar263;
                  auVar184._0_4_ = *(float *)(ray + 0x70) - fVar263;
                  auVar184._4_4_ = *(float *)(ray + 0x74) - fVar263;
                  auVar184._8_4_ = *(float *)(ray + 0x78) - fVar263;
                  auVar184._12_4_ = *(float *)(ray + 0x7c) - fVar263;
                  auVar149._4_4_ = auVar149._0_4_;
                  auVar149._8_4_ = auVar149._0_4_;
                  auVar149._12_4_ = auVar149._0_4_;
                  auVar116 = divps(auVar184,auVar149);
                  auVar185._0_4_ = auVar116._0_4_ * fVar243;
                  auVar185._4_4_ = auVar116._4_4_ * fVar243;
                  auVar185._8_4_ = auVar116._8_4_ * fVar243;
                  auVar185._12_4_ = auVar116._12_4_ * fVar243;
                  auVar116 = roundps(auVar121,auVar185,1);
                  auVar91._0_4_ = fVar243 + -1.0;
                  auVar91._4_4_ = auVar91._0_4_;
                  auVar91._8_4_ = auVar91._0_4_;
                  auVar91._12_4_ = auVar91._0_4_;
                  auVar116 = minps(auVar116,auVar91);
                  auVar116 = maxps(auVar116,_DAT_01feba10);
                  ftime.field_0.v[0] = auVar185._0_4_ - auVar116._0_4_;
                  ftime.field_0.v[1] = auVar185._4_4_ - auVar116._4_4_;
                  ftime.field_0.v[2] = auVar185._8_4_ - auVar116._8_4_;
                  ftime.field_0.v[3] = auVar185._12_4_ - auVar116._12_4_;
                  itime.field_0.i[0] = (int)auVar116._0_4_;
                  itime.field_0.i[1] = (int)auVar116._4_4_;
                  itime.field_0.i[2] = (int)auVar116._8_4_;
                  itime.field_0.i[3] = (int)auVar116._12_4_;
                  uVar140 = uVar18 & 0x7fff;
                  local_1258._0_4_ = uVar140;
                  local_1178 = lVar61;
                  uVar141 = uVar19 & 0x7fff;
                  local_1268._0_4_ = uVar141;
                  uVar115 = *(uint *)(lVar71 + 4 + lVar61);
                  uVar73 = (ulong)uVar115;
                  uVar62 = (ulong)(uVar115 * uVar141 + *(int *)(lVar71 + lVar61) + uVar140);
                  lVar23 = *(long *)&pGVar22[2].numPrimitives;
                  lVar72 = (long)itime.field_0.i[k] * 0x38;
                  lVar24 = *(long *)(lVar23 + 0x10 + lVar72);
                  lVar25 = *(long *)(lVar23 + lVar72);
                  pfVar12 = (float *)(lVar25 + lVar24 * uVar62);
                  lVar26 = *(long *)(lVar23 + 0x48 + lVar72);
                  pfVar13 = (float *)(lVar25 + (uVar62 + 1) * lVar24);
                  lVar74 = uVar62 + uVar73;
                  pfVar14 = (float *)(lVar25 + lVar74 * lVar24);
                  lVar69 = uVar62 + uVar73 + 1;
                  pfVar15 = (float *)(lVar25 + lVar69 * lVar24);
                  uVar66 = (ulong)(-1 < (short)uVar18);
                  lVar63 = uVar62 + uVar66 + 1;
                  pfVar1 = (float *)(lVar25 + lVar63 * lVar24);
                  lVar68 = uVar66 + lVar69;
                  uVar66 = 0;
                  if (-1 < (short)uVar19) {
                    uVar66 = uVar73;
                  }
                  pfVar2 = (float *)(lVar25 + lVar68 * lVar24);
                  pfVar3 = (float *)(lVar25 + (lVar74 + uVar66) * lVar24);
                  pfVar4 = (float *)(lVar25 + (lVar69 + uVar66) * lVar24);
                  lVar25 = lVar25 + lVar24 * (uVar66 + lVar68);
                  fVar176 = *(float *)(lVar25 + 4);
                  fVar263 = *(float *)(lVar25 + 8);
                  lVar25 = *(long *)(lVar23 + 0x38 + lVar72);
                  pfVar5 = (float *)(lVar25 + lVar26 * uVar62);
                  pfVar6 = (float *)(lVar25 + lVar26 * (uVar62 + 1));
                  pfVar7 = (float *)(lVar25 + lVar26 * lVar74);
                  pfVar8 = (float *)(lVar25 + lVar26 * lVar69);
                  pfVar9 = (float *)(lVar25 + lVar26 * lVar63);
                  pfVar10 = (float *)(lVar25 + lVar26 * lVar68);
                  fVar243 = *(float *)((long)&stack[-1].ptr.ptr + k * 4);
                  pfVar11 = (float *)(lVar25 + lVar26 * (lVar74 + uVar66));
                  fVar284 = (*pfVar6 - *pfVar13) * fVar243 + *pfVar13;
                  fVar286 = (pfVar6[1] - pfVar13[1]) * fVar243 + pfVar13[1];
                  fVar288 = (pfVar6[2] - pfVar13[2]) * fVar243 + pfVar13[2];
                  pfVar13 = (float *)(lVar25 + lVar26 * (lVar69 + uVar66));
                  local_1208 = (*pfVar7 - *pfVar14) * fVar243 + *pfVar14;
                  fVar234 = (pfVar7[1] - pfVar14[1]) * fVar243 + pfVar14[1];
                  fVar238 = (pfVar7[2] - pfVar14[2]) * fVar243 + pfVar14[2];
                  lVar25 = lVar25 + (uVar66 + lVar68) * lVar26;
                  fVar161 = *(float *)(lVar25 + 4);
                  fVar191 = (*pfVar8 - *pfVar15) * fVar243 + *pfVar15;
                  fVar201 = (pfVar8[1] - pfVar15[1]) * fVar243 + pfVar15[1];
                  fVar204 = (pfVar8[2] - pfVar15[2]) * fVar243 + pfVar15[2];
                  fVar265 = (pfVar9[1] - pfVar1[1]) * fVar243 + pfVar1[1];
                  fVar267 = (pfVar9[2] - pfVar1[2]) * fVar243 + pfVar1[2];
                  fVar225 = (*pfVar10 - *pfVar2) * fVar243 + *pfVar2;
                  fVar235 = (pfVar10[1] - pfVar2[1]) * fVar243 + pfVar2[1];
                  fVar240 = (pfVar10[2] - pfVar2[2]) * fVar243 + pfVar2[2];
                  fStack_11f4 = (*pfVar11 - *pfVar3) * fVar243 + *pfVar3;
                  fVar252 = (pfVar11[1] - pfVar3[1]) * fVar243 + pfVar3[1];
                  local_11f8 = (*pfVar13 - *pfVar4) * fVar243 + *pfVar4;
                  fVar233 = (pfVar13[1] - pfVar4[1]) * fVar243 + pfVar4[1];
                  fStack_11d4 = (pfVar13[2] - pfVar4[2]) * fVar243 + pfVar4[2];
                  fStack_11d8 = (*(float *)(lVar25 + 8) - fVar263) * fVar243 + fVar263;
                  fVar263 = *(float *)(local_1188 + k * 4);
                  fVar207 = *(float *)(local_1188 + k * 4 + 0x10);
                  fVar253 = ((*pfVar5 - *pfVar12) * fVar243 + *pfVar12) - fVar263;
                  fVar255 = fVar284 - fVar263;
                  fVar258 = fVar191 - fVar263;
                  fVar262 = local_1208 - fVar263;
                  local_1218._0_4_ = ((pfVar5[1] - pfVar12[1]) * fVar243 + pfVar12[1]) - fVar207;
                  local_1218._4_4_ = fVar286 - fVar207;
                  fStack_1210 = fVar201 - fVar207;
                  fStack_120c = fVar234 - fVar207;
                  local_11e8 = fVar225;
                  fStack_11e4 = fVar191;
                  fVar284 = fVar284 - fVar263;
                  fVar202 = ((*pfVar9 - *pfVar1) * fVar243 + *pfVar1) - fVar263;
                  fVar205 = fVar225 - fVar263;
                  fVar206 = fVar191 - fVar263;
                  fStack_1204 = fVar191;
                  fVar246 = local_1208 - fVar263;
                  fVar256 = fVar191 - fVar263;
                  fVar144 = local_11f8 - fVar263;
                  fVar263 = fStack_11f4 - fVar263;
                  fVar275 = fVar286 - fVar207;
                  fVar276 = fVar265 - fVar207;
                  fVar277 = fVar235 - fVar207;
                  fVar278 = fVar201 - fVar207;
                  fVar223 = fVar234 - fVar207;
                  fVar237 = fVar201 - fVar207;
                  fVar260 = fVar233 - fVar207;
                  fVar207 = fVar252 - fVar207;
                  fVar216 = *(float *)(local_1188 + k * 4 + 0x20);
                  local_fc8 = ((pfVar5[2] - pfVar12[2]) * fVar243 + pfVar12[2]) - fVar216;
                  fStack_fc4 = fVar288 - fVar216;
                  fStack_fc0 = fVar204 - fVar216;
                  fStack_fbc = fVar238 - fVar216;
                  fVar285 = fVar288 - fVar216;
                  fVar287 = fVar267 - fVar216;
                  fVar289 = fVar240 - fVar216;
                  fVar290 = fVar204 - fVar216;
                  fVar200 = fVar238 - fVar216;
                  fVar203 = fVar204 - fVar216;
                  fVar242 = fStack_11d4 - fVar216;
                  fVar216 = ((pfVar11[2] - pfVar3[2]) * fVar243 + pfVar3[2]) - fVar216;
                  fVar226 = fVar246 - fVar253;
                  fVar236 = fVar256 - fVar255;
                  fVar241 = fVar144 - fVar258;
                  fVar245 = fVar263 - fVar262;
                  local_fd8 = fVar223 - (float)local_1218._0_4_;
                  fStack_fd4 = fVar237 - (float)local_1218._4_4_;
                  fStack_fd0 = fVar260 - fStack_1210;
                  fStack_fcc = fVar207 - fStack_120c;
                  local_fb8 = fVar200 - local_fc8;
                  fStack_fb4 = fVar203 - fStack_fc4;
                  fStack_fb0 = fVar242 - fStack_fc0;
                  fStack_fac = fVar216 - fStack_fbc;
                  fVar239 = *(float *)(local_1188 + k * 4 + 0x50);
                  local_fe8 = *(float *)(local_1188 + k * 4 + 0x60);
                  fVar244 = *(float *)(local_1188 + k * 4 + 0x40);
                  local_1028 = (local_fd8 * (fVar200 + local_fc8) -
                               (fVar223 + (float)local_1218._0_4_) * local_fb8) * fVar244 +
                               ((fVar246 + fVar253) * local_fb8 - (fVar200 + local_fc8) * fVar226) *
                               fVar239 + (fVar226 * (fVar223 + (float)local_1218._0_4_) -
                                         (fVar246 + fVar253) * local_fd8) * local_fe8;
                  fStack_1024 = (fStack_fd4 * (fVar203 + fStack_fc4) -
                                (fVar237 + (float)local_1218._4_4_) * fStack_fb4) * fVar244 +
                                ((fVar256 + fVar255) * fStack_fb4 - (fVar203 + fStack_fc4) * fVar236
                                ) * fVar239 +
                                (fVar236 * (fVar237 + (float)local_1218._4_4_) -
                                (fVar256 + fVar255) * fStack_fd4) * local_fe8;
                  fStack_1020 = (fStack_fd0 * (fVar242 + fStack_fc0) -
                                (fVar260 + fStack_1210) * fStack_fb0) * fVar244 +
                                ((fVar144 + fVar258) * fStack_fb0 - (fVar242 + fStack_fc0) * fVar241
                                ) * fVar239 +
                                (fVar241 * (fVar260 + fStack_1210) -
                                (fVar144 + fVar258) * fStack_fd0) * local_fe8;
                  fStack_101c = (fStack_fcc * (fVar216 + fStack_fbc) -
                                (fVar207 + fStack_120c) * fStack_fac) * fVar244 +
                                ((fVar263 + fVar262) * fStack_fac - (fVar216 + fStack_fbc) * fVar245
                                ) * fVar239 +
                                (fVar245 * (fVar207 + fStack_120c) -
                                (fVar263 + fVar262) * fStack_fcc) * local_fe8;
                  fVar224 = fVar253 - fVar284;
                  fVar247 = fVar255 - fVar202;
                  fVar248 = fVar258 - fVar205;
                  fVar249 = fVar262 - fVar206;
                  fVar254 = (float)local_1218._0_4_ - fVar275;
                  fVar257 = (float)local_1218._4_4_ - fVar276;
                  fVar259 = fStack_1210 - fVar277;
                  fVar190 = fStack_120c - fVar278;
                  local_ff8 = local_fc8 - fVar285;
                  fStack_ff4 = fStack_fc4 - fVar287;
                  fStack_ff0 = fStack_fc0 - fVar289;
                  fStack_fec = fStack_fbc - fVar290;
                  local_1018 = (fVar254 * (local_fc8 + fVar285) -
                               ((float)local_1218._0_4_ + fVar275) * local_ff8) * fVar244 +
                               ((fVar253 + fVar284) * local_ff8 - (local_fc8 + fVar285) * fVar224) *
                               fVar239 + (fVar224 * ((float)local_1218._0_4_ + fVar275) -
                                         (fVar253 + fVar284) * fVar254) * local_fe8;
                  fStack_1014 = (fVar257 * (fStack_fc4 + fVar287) -
                                ((float)local_1218._4_4_ + fVar276) * fStack_ff4) * fVar244 +
                                ((fVar255 + fVar202) * fStack_ff4 - (fStack_fc4 + fVar287) * fVar247
                                ) * fVar239 +
                                (fVar247 * ((float)local_1218._4_4_ + fVar276) -
                                (fVar255 + fVar202) * fVar257) * local_fe8;
                  fStack_1010 = (fVar259 * (fStack_fc0 + fVar289) -
                                (fStack_1210 + fVar277) * fStack_ff0) * fVar244 +
                                ((fVar258 + fVar205) * fStack_ff0 - (fStack_fc0 + fVar289) * fVar248
                                ) * fVar239 +
                                (fVar248 * (fStack_1210 + fVar277) - (fVar258 + fVar205) * fVar259)
                                * local_fe8;
                  fStack_100c = (fVar190 * (fStack_fbc + fVar290) -
                                (fStack_120c + fVar278) * fStack_fec) * fVar244 +
                                ((fVar262 + fVar206) * fStack_fec - (fStack_fbc + fVar290) * fVar249
                                ) * fVar239 +
                                (fVar249 * (fStack_120c + fVar278) - (fVar262 + fVar206) * fVar190)
                                * local_fe8;
                  fVar279 = fVar284 - fVar246;
                  fVar281 = fVar202 - fVar256;
                  fVar282 = fVar205 - fVar144;
                  fVar283 = fVar206 - fVar263;
                  fVar209 = fVar275 - fVar223;
                  fVar218 = fVar276 - fVar237;
                  fVar220 = fVar277 - fVar260;
                  fVar222 = fVar278 - fVar207;
                  fVar264 = fVar285 - fVar200;
                  fVar266 = fVar287 - fVar203;
                  fVar268 = fVar289 - fVar242;
                  fVar269 = fVar290 - fVar216;
                  fStack_fe4 = local_fe8;
                  fStack_fe0 = local_fe8;
                  fStack_fdc = local_fe8;
                  fVar223 = (fVar209 * (fVar200 + fVar285) - (fVar223 + fVar275) * fVar264) *
                            fVar244 + ((fVar246 + fVar284) * fVar264 - (fVar200 + fVar285) * fVar279
                                      ) * fVar239 +
                                      (fVar279 * (fVar223 + fVar275) - (fVar246 + fVar284) * fVar209
                                      ) * local_fe8;
                  fVar237 = (fVar218 * (fVar203 + fVar287) - (fVar237 + fVar276) * fVar266) *
                            fVar244 + ((fVar256 + fVar202) * fVar266 - (fVar203 + fVar287) * fVar281
                                      ) * fVar239 +
                                      (fVar281 * (fVar237 + fVar276) - (fVar256 + fVar202) * fVar218
                                      ) * local_fe8;
                  fVar144 = (fVar220 * (fVar242 + fVar289) - (fVar260 + fVar277) * fVar268) *
                            fVar244 + ((fVar144 + fVar205) * fVar268 - (fVar242 + fVar289) * fVar282
                                      ) * fVar239 +
                                      (fVar282 * (fVar260 + fVar277) - (fVar144 + fVar205) * fVar220
                                      ) * local_fe8;
                  fVar263 = (fVar222 * (fVar216 + fVar290) - (fVar207 + fVar278) * fVar269) *
                            fVar244 + ((fVar263 + fVar206) * fVar269 - (fVar216 + fVar290) * fVar283
                                      ) * fVar239 +
                                      (fVar283 * (fVar207 + fVar278) - (fVar263 + fVar206) * fVar222
                                      ) * local_fe8;
                  fVar207 = local_1028 + local_1018 + fVar223;
                  fVar216 = fStack_1024 + fStack_1014 + fVar237;
                  fVar246 = fStack_1020 + fStack_1010 + fVar144;
                  fVar256 = fStack_101c + fStack_100c + fVar263;
                  auVar92._4_4_ = fStack_1024;
                  auVar92._0_4_ = local_1028;
                  auVar92._8_4_ = fStack_1020;
                  auVar92._12_4_ = fStack_101c;
                  auVar40._4_4_ = fStack_1014;
                  auVar40._0_4_ = local_1018;
                  auVar40._8_4_ = fStack_1010;
                  auVar40._12_4_ = fStack_100c;
                  auVar116 = minps(auVar92,auVar40);
                  auVar43._4_4_ = fVar237;
                  auVar43._0_4_ = fVar223;
                  auVar43._8_4_ = fVar144;
                  auVar43._12_4_ = fVar263;
                  auVar116 = minps(auVar116,auVar43);
                  auVar196._4_4_ = fStack_1024;
                  auVar196._0_4_ = local_1028;
                  auVar196._8_4_ = fStack_1020;
                  auVar196._12_4_ = fStack_101c;
                  auVar41._4_4_ = fStack_1014;
                  auVar41._0_4_ = local_1018;
                  auVar41._8_4_ = fStack_1010;
                  auVar41._12_4_ = fStack_100c;
                  auVar180 = maxps(auVar196,auVar41);
                  auVar44._4_4_ = fVar237;
                  auVar44._0_4_ = fVar223;
                  auVar44._8_4_ = fVar144;
                  auVar44._12_4_ = fVar263;
                  auVar180 = maxps(auVar180,auVar44);
                  local_1038 = ABS(fVar207);
                  fStack_1034 = ABS(fVar216);
                  fStack_1030 = ABS(fVar246);
                  fStack_102c = ABS(fVar256);
                  auVar197._4_4_ = -(uint)(auVar180._4_4_ <= fStack_1034 * 1.1920929e-07);
                  auVar197._0_4_ = -(uint)(auVar180._0_4_ <= local_1038 * 1.1920929e-07);
                  auVar197._8_4_ = -(uint)(auVar180._8_4_ <= fStack_1030 * 1.1920929e-07);
                  auVar197._12_4_ = -(uint)(auVar180._12_4_ <= fStack_102c * 1.1920929e-07);
                  auVar93._4_4_ = -(uint)(-(fStack_1034 * 1.1920929e-07) <= auVar116._4_4_);
                  auVar93._0_4_ = -(uint)(-(local_1038 * 1.1920929e-07) <= auVar116._0_4_);
                  auVar93._8_4_ = -(uint)(-(fStack_1030 * 1.1920929e-07) <= auVar116._8_4_);
                  auVar93._12_4_ = -(uint)(-(fStack_102c * 1.1920929e-07) <= auVar116._12_4_);
                  auVar197 = auVar197 | auVar93;
                  uVar115 = movmskps((int)k,auVar197);
                  local_1258 = ZEXT416(uVar140);
                  local_1268 = ZEXT416(uVar141);
                  fVar263 = fVar114;
                  local_13e0 = lVar71;
                  local_13d8 = uVar70;
                  local_13d0 = uVar60;
                  if (uVar115 != 0) {
                    local_1008 = fVar224;
                    fStack_1004 = fVar247;
                    fStack_1000 = fVar248;
                    fStack_ffc = fVar249;
                    auVar270._0_4_ = local_fd8 * local_ff8 - fVar254 * local_fb8;
                    auVar270._4_4_ = fStack_fd4 * fStack_ff4 - fVar257 * fStack_fb4;
                    auVar270._8_4_ = fStack_fd0 * fStack_ff0 - fVar259 * fStack_fb0;
                    auVar270._12_4_ = fStack_fcc * fStack_fec - fVar190 * fStack_fac;
                    auVar273._0_4_ = fVar254 * fVar264 - fVar209 * local_ff8;
                    auVar273._4_4_ = fVar257 * fVar266 - fVar218 * fStack_ff4;
                    auVar273._8_4_ = fVar259 * fVar268 - fVar220 * fStack_ff0;
                    auVar273._12_4_ = fVar190 * fVar269 - fVar222 * fStack_fec;
                    auVar94._4_4_ = -(uint)(ABS(fVar257 * fStack_fb4) < ABS(fVar218 * fStack_ff4));
                    auVar94._0_4_ = -(uint)(ABS(fVar254 * local_fb8) < ABS(fVar209 * local_ff8));
                    auVar94._8_4_ = -(uint)(ABS(fVar259 * fStack_fb0) < ABS(fVar220 * fStack_ff0));
                    auVar94._12_4_ = -(uint)(ABS(fVar190 * fStack_fac) < ABS(fVar222 * fStack_fec));
                    local_1298 = blendvps(auVar273,auVar270,auVar94);
                    auVar186._0_4_ = local_fb8 * fVar224 - fVar226 * local_ff8;
                    auVar186._4_4_ = fStack_fb4 * fVar247 - fVar236 * fStack_ff4;
                    auVar186._8_4_ = fStack_fb0 * fVar248 - fVar241 * fStack_ff0;
                    auVar186._12_4_ = fStack_fac * fVar249 - fVar245 * fStack_fec;
                    auVar280._0_4_ = fVar279 * local_ff8 - fVar224 * fVar264;
                    auVar280._4_4_ = fVar281 * fStack_ff4 - fVar247 * fVar266;
                    auVar280._8_4_ = fVar282 * fStack_ff0 - fVar248 * fVar268;
                    auVar280._12_4_ = fVar283 * fStack_fec - fVar249 * fVar269;
                    auVar95._4_4_ = -(uint)(ABS(fVar236 * fStack_ff4) < ABS(fVar247 * fVar266));
                    auVar95._0_4_ = -(uint)(ABS(fVar226 * local_ff8) < ABS(fVar224 * fVar264));
                    auVar95._8_4_ = -(uint)(ABS(fVar241 * fStack_ff0) < ABS(fVar248 * fVar268));
                    auVar95._12_4_ = -(uint)(ABS(fVar245 * fStack_fec) < ABS(fVar249 * fVar269));
                    local_1288 = blendvps(auVar280,auVar186,auVar95);
                    auVar212._0_4_ = fVar224 * fVar209 - fVar279 * fVar254;
                    auVar212._4_4_ = fVar247 * fVar218 - fVar281 * fVar257;
                    auVar212._8_4_ = fVar248 * fVar220 - fVar282 * fVar259;
                    auVar212._12_4_ = fVar249 * fVar222 - fVar283 * fVar190;
                    auVar51._4_4_ = fVar216;
                    auVar51._0_4_ = fVar207;
                    auVar51._8_4_ = fVar246;
                    auVar51._12_4_ = fVar256;
                    auVar96._4_4_ = -(uint)(ABS(fVar247 * fStack_fd4) < ABS(fVar281 * fVar257));
                    auVar96._0_4_ = -(uint)(ABS(fVar224 * local_fd8) < ABS(fVar279 * fVar254));
                    auVar96._8_4_ = -(uint)(ABS(fVar248 * fStack_fd0) < ABS(fVar282 * fVar259));
                    auVar96._12_4_ = -(uint)(ABS(fVar249 * fStack_fcc) < ABS(fVar283 * fVar190));
                    auVar42._4_4_ = fVar236 * fVar257 - fVar247 * fStack_fd4;
                    auVar42._0_4_ = fVar226 * fVar254 - fVar224 * local_fd8;
                    auVar42._8_4_ = fVar241 * fVar259 - fVar248 * fStack_fd0;
                    auVar42._12_4_ = fVar245 * fVar190 - fVar249 * fStack_fcc;
                    local_1278 = blendvps(auVar212,auVar42,auVar96);
                    fVar144 = fVar244 * local_1298._0_4_ +
                              fVar239 * local_1288._0_4_ + local_fe8 * local_1278._0_4_;
                    fVar223 = fVar244 * local_1298._4_4_ +
                              fVar239 * local_1288._4_4_ + local_fe8 * local_1278._4_4_;
                    fVar237 = fVar244 * local_1298._8_4_ +
                              fVar239 * local_1288._8_4_ + local_fe8 * local_1278._8_4_;
                    fVar239 = fVar244 * local_1298._12_4_ +
                              fVar239 * local_1288._12_4_ + local_fe8 * local_1278._12_4_;
                    auVar231._0_4_ = fVar144 + fVar144;
                    auVar231._4_4_ = fVar223 + fVar223;
                    auVar231._8_4_ = fVar237 + fVar237;
                    auVar231._12_4_ = fVar239 + fVar239;
                    auVar122._0_4_ = local_fc8 * local_1278._0_4_;
                    auVar122._4_4_ = fStack_fc4 * local_1278._4_4_;
                    auVar122._8_4_ = fStack_fc0 * local_1278._8_4_;
                    auVar122._12_4_ = fStack_fbc * local_1278._12_4_;
                    fVar237 = fVar253 * local_1298._0_4_ +
                              (float)local_1218._0_4_ * local_1288._0_4_ + auVar122._0_4_;
                    fVar260 = fVar255 * local_1298._4_4_ +
                              (float)local_1218._4_4_ * local_1288._4_4_ + auVar122._4_4_;
                    fVar200 = fVar258 * local_1298._8_4_ +
                              fStack_1210 * local_1288._8_4_ + auVar122._8_4_;
                    fVar203 = fVar262 * local_1298._12_4_ +
                              fStack_120c * local_1288._12_4_ + auVar122._12_4_;
                    auVar116 = rcpps(auVar122,auVar231);
                    fVar239 = auVar116._0_4_;
                    fVar244 = auVar116._4_4_;
                    fVar144 = auVar116._8_4_;
                    fVar223 = auVar116._12_4_;
                    local_12a8[0] =
                         ((1.0 - auVar231._0_4_ * fVar239) * fVar239 + fVar239) *
                         (fVar237 + fVar237);
                    local_12a8[1] =
                         ((1.0 - auVar231._4_4_ * fVar244) * fVar244 + fVar244) *
                         (fVar260 + fVar260);
                    local_12a8[2] =
                         ((1.0 - auVar231._8_4_ * fVar144) * fVar144 + fVar144) *
                         (fVar200 + fVar200);
                    local_12a8[3] =
                         ((1.0 - auVar231._12_4_ * fVar223) * fVar223 + fVar223) *
                         (fVar203 + fVar203);
                    fVar239 = *(float *)(local_1188 + k * 4 + 0x30);
                    iVar75 = -(uint)(fVar239 <= local_12a8[1]);
                    iVar76 = -(uint)(fVar239 <= local_12a8[2]);
                    iVar77 = -(uint)(fVar239 <= local_12a8[3]);
                    auVar150._8_4_ = iVar76;
                    auVar150._4_4_ = iVar75;
                    auVar150._12_4_ = iVar77;
                    auVar123._0_4_ =
                         -(uint)(local_12a8[0] <= fVar261 && fVar239 <= local_12a8[0]) &
                         auVar197._0_4_;
                    auVar123._4_4_ =
                         -(uint)(local_12a8[1] <= fVar261 && fVar239 <= local_12a8[1]) &
                         auVar197._4_4_;
                    auVar123._8_4_ =
                         -(uint)(local_12a8[2] <= fVar261 && fVar239 <= local_12a8[2]) &
                         auVar197._8_4_;
                    auVar123._12_4_ =
                         -(uint)(local_12a8[3] <= fVar261 && fVar239 <= local_12a8[3]) &
                         auVar197._12_4_;
                    uVar115 = movmskps(uVar115,auVar123);
                    if (uVar115 != 0) {
                      valid.field_0.i[0] = auVar123._0_4_ & -(uint)(auVar231._0_4_ != 0.0);
                      valid.field_0.i[1] = auVar123._4_4_ & -(uint)(auVar231._4_4_ != 0.0);
                      valid.field_0.i[2] = auVar123._8_4_ & -(uint)(auVar231._8_4_ != 0.0);
                      valid.field_0.i[3] = auVar123._12_4_ & -(uint)(auVar231._12_4_ != 0.0);
                      uVar115 = movmskps(uVar115,(undefined1  [16])valid.field_0);
                      if (uVar115 != 0) {
                        auVar150._0_4_ = (float)(int)(*(ushort *)(lVar71 + 8 + lVar61) - 1);
                        auVar187._4_4_ = iVar75;
                        auVar187._0_4_ = auVar150._0_4_;
                        auVar187._8_4_ = iVar76;
                        auVar187._12_4_ = iVar77;
                        auVar116 = rcpss(auVar187,auVar150);
                        auVar198._4_12_ = auVar197._4_12_;
                        auVar198._0_4_ = (float)(int)(*(ushort *)(lVar71 + 10 + lVar61) - 1);
                        fVar261 = (2.0 - auVar150._0_4_ * auVar116._0_4_) * auVar116._0_4_;
                        auVar188._4_4_ = auVar197._4_4_;
                        auVar188._0_4_ = auVar198._0_4_;
                        auVar188._8_4_ = auVar197._8_4_;
                        auVar188._12_4_ = auVar197._12_4_;
                        auVar116 = rcpss(auVar188,auVar198);
                        fVar239 = (2.0 - auVar198._0_4_ * auVar116._0_4_) * auVar116._0_4_;
                        auVar168._0_4_ = (float)uVar140 * fVar207 + local_1028;
                        auVar168._4_4_ = (float)(uVar140 + 1) * fVar216 + fStack_1024;
                        auVar168._8_4_ = (float)(uVar140 + 1) * fVar246 + fStack_1020;
                        auVar168._12_4_ = (float)uVar140 * fVar256 + fStack_101c;
                        tNear.field_0.v[1] = fVar261 * auVar168._4_4_;
                        tNear.field_0.v[0] = fVar261 * auVar168._0_4_;
                        tNear.field_0.v[2] = fVar261 * auVar168._8_4_;
                        tNear.field_0.v[3] = fVar261 * auVar168._12_4_;
                        pGVar22 = (local_1180->geometries).items[uVar60].ptr;
                        uVar115 = *(uint *)(local_1188 + k * 4 + 0x90);
                        if ((pGVar22->mask & uVar115) != 0) {
                          auVar116 = rcpps(auVar168,auVar51);
                          fVar244 = auVar116._0_4_;
                          fVar144 = auVar116._4_4_;
                          fVar223 = auVar116._8_4_;
                          fVar237 = auVar116._12_4_;
                          fVar244 = (float)(-(uint)(1e-18 <= local_1038) &
                                           (uint)(((float)DAT_01feca10 - fVar207 * fVar244) *
                                                  fVar244 + fVar244));
                          fVar144 = (float)(-(uint)(1e-18 <= fStack_1034) &
                                           (uint)((DAT_01feca10._4_4_ - fVar216 * fVar144) * fVar144
                                                 + fVar144));
                          fVar223 = (float)(-(uint)(1e-18 <= fStack_1030) &
                                           (uint)((DAT_01feca10._8_4_ - fVar246 * fVar223) * fVar223
                                                 + fVar223));
                          fVar237 = (float)(-(uint)(1e-18 <= fStack_102c) &
                                           (uint)((DAT_01feca10._12_4_ - fVar256 * fVar237) *
                                                  fVar237 + fVar237));
                          auVar124._0_4_ = fVar261 * auVar168._0_4_ * fVar244;
                          auVar124._4_4_ = fVar261 * auVar168._4_4_ * fVar144;
                          auVar124._8_4_ = fVar261 * auVar168._8_4_ * fVar223;
                          auVar124._12_4_ = fVar261 * auVar168._12_4_ * fVar237;
                          local_12c8 = minps(auVar124,_DAT_01feca10);
                          auVar151._0_4_ =
                               fVar239 * ((float)uVar141 * fVar207 + local_1018) * fVar244;
                          auVar151._4_4_ =
                               fVar239 * ((float)uVar141 * fVar216 + fStack_1014) * fVar144;
                          auVar151._8_4_ =
                               fVar239 * ((float)(uVar141 + 1) * fVar246 + fStack_1010) * fVar223;
                          auVar151._12_4_ =
                               fVar239 * ((float)(uVar141 + 1) * fVar256 + fStack_100c) * fVar237;
                          local_12b8 = minps(auVar151,_DAT_01feca10);
                          auVar52._4_4_ = local_12a8[1];
                          auVar52._0_4_ = local_12a8[0];
                          auVar52._8_4_ = local_12a8[2];
                          auVar52._12_4_ = local_12a8[3];
                          auVar180 = blendvps(_DAT_01feb9f0,auVar52,(undefined1  [16])valid.field_0)
                          ;
                          auVar169._4_4_ = auVar180._0_4_;
                          auVar169._0_4_ = auVar180._4_4_;
                          auVar169._8_4_ = auVar180._12_4_;
                          auVar169._12_4_ = auVar180._8_4_;
                          auVar116 = minps(auVar169,auVar180);
                          auVar125._0_8_ = auVar116._8_8_;
                          auVar125._8_4_ = auVar116._0_4_;
                          auVar125._12_4_ = auVar116._4_4_;
                          auVar116 = minps(auVar125,auVar116);
                          auVar126._0_8_ =
                               CONCAT44(-(uint)(auVar116._4_4_ == auVar180._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar116._0_4_ == auVar180._0_4_) &
                                        valid.field_0.i[0]);
                          auVar126._8_4_ =
                               -(uint)(auVar116._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                          auVar126._12_4_ =
                               -(uint)(auVar116._12_4_ == auVar180._12_4_) & valid.field_0.i[3];
                          iVar75 = movmskps(uVar115,auVar126);
                          aVar97 = valid.field_0;
                          if (iVar75 != 0) {
                            aVar97.i[2] = auVar126._8_4_;
                            aVar97._0_8_ = auVar126._0_8_;
                            aVar97.i[3] = auVar126._12_4_;
                          }
                          uVar115 = movmskps(iVar75,(undefined1  [16])aVar97);
                          lVar74 = 0;
                          if (uVar115 != 0) {
                            for (; (uVar115 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                            }
                          }
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar20 = *(undefined4 *)(local_12c8 + lVar74 * 4);
                            fVar261 = local_12a8[lVar74 + -4];
                            uVar58 = *(undefined4 *)(local_1298 + lVar74 * 4);
                            uVar16 = *(undefined4 *)(local_1288 + lVar74 * 4);
                            uVar17 = *(undefined4 *)(local_1278 + lVar74 * 4);
                            *(float *)(local_1188 + k * 4 + 0x80) = local_12a8[lVar74];
                            *(undefined4 *)(local_1188 + k * 4 + 0xc0) = uVar58;
                            *(undefined4 *)(local_1188 + k * 4 + 0xd0) = uVar16;
                            *(undefined4 *)(local_1188 + k * 4 + 0xe0) = uVar17;
                            *(undefined4 *)(local_1188 + k * 4 + 0xf0) = uVar20;
                            *(float *)(local_1188 + k * 4 + 0x100) = fVar261;
                            *(float *)(local_1188 + k * 4 + 0x110) = fVar114;
                            *(uint *)(local_1188 + k * 4 + 0x120) = (uint)uStack_1440;
                            *(uint *)(local_1188 + k * 4 + 0x130) = context->user->instID[0];
                            uVar115 = context->user->instPrimID[0];
                            *(uint *)(local_1188 + k * 4 + 0x140) = uVar115;
                          }
                          else {
                            local_1378 = CONCAT44(fVar114,fVar114);
                            uStack_1370._0_4_ = fVar114;
                            uStack_1370._4_4_ = fVar114;
                            uVar21 = *(undefined8 *)(mm_lookupmask_ps + lVar59);
                            uVar46 = *(undefined8 *)(mm_lookupmask_ps + lVar59 + 8);
                            do {
                              uVar58 = *(undefined4 *)(pRVar57 + k * 4 + 0x80);
                              local_1098 = *(undefined4 *)(local_12c8 + lVar74 * 4);
                              local_1088 = local_12a8[lVar74 + -4];
                              *(float *)(pRVar57 + k * 4 + 0x80) = local_12a8[lVar74];
                              args.context = context->user;
                              local_10c8 = *(undefined4 *)(local_1298 + lVar74 * 4);
                              local_10b8._4_4_ = *(undefined4 *)(local_1288 + lVar74 * 4);
                              local_10a8._4_4_ = *(undefined4 *)(local_1278 + lVar74 * 4);
                              uStack_10c4 = local_10c8;
                              uStack_10c0 = local_10c8;
                              uStack_10bc = local_10c8;
                              local_10b8._0_4_ = local_10b8._4_4_;
                              local_10b8._8_4_ = local_10b8._4_4_;
                              local_10b8._12_4_ = local_10b8._4_4_;
                              local_10a8._0_4_ = local_10a8._4_4_;
                              local_10a8._8_4_ = local_10a8._4_4_;
                              local_10a8._12_4_ = local_10a8._4_4_;
                              uStack_1094 = local_1098;
                              uStack_1090 = local_1098;
                              uStack_108c = local_1098;
                              fStack_1084 = local_1088;
                              fStack_1080 = local_1088;
                              fStack_107c = local_1088;
                              local_1078 = local_1378;
                              uStack_1070 = uStack_1370;
                              local_1068 = CONCAT44((uint)uStack_1440,(uint)uStack_1440);
                              uStack_1060 = CONCAT44((uint)uStack_1440,(uint)uStack_1440);
                              local_1058 = (args.context)->instID[0];
                              uStack_1054 = local_1058;
                              uStack_1050 = local_1058;
                              uStack_104c = local_1058;
                              local_1048 = (args.context)->instPrimID[0];
                              uStack_1044 = local_1048;
                              uStack_1040 = local_1048;
                              uStack_103c = local_1048;
                              args.valid = (int *)&local_13f8;
                              pRVar65 = (RTCIntersectArguments *)pGVar22->userPtr;
                              args.ray = (RTCRayN *)pRVar57;
                              args.hit = (RTCHitN *)&local_10c8;
                              args.N = 4;
                              pRVar64 = (RTCRayN *)pGVar22->intersectionFilterN;
                              local_13f8 = uVar21;
                              uStack_13f0 = uVar46;
                              args.geometryUserPtr = pRVar65;
                              if (pRVar64 != (RTCRayN *)0x0) {
                                pRVar64 = (RTCRayN *)(*(code *)pRVar64)(&args);
                                uVar60 = local_13d0;
                                uVar70 = local_13d8;
                                lVar71 = local_13e0;
                              }
                              auVar47._8_8_ = uStack_13f0;
                              auVar47._0_8_ = local_13f8;
                              if (auVar47 == (undefined1  [16])0x0) {
                                auVar134._8_4_ = 0xffffffff;
                                auVar134._0_8_ = 0xffffffffffffffff;
                                auVar134._12_4_ = 0xffffffff;
                                auVar134 = auVar134 ^ _DAT_01febe20;
                              }
                              else {
                                pRVar65 = context->args;
                                pRVar64 = (RTCRayN *)pRVar65->filter;
                                if ((pRVar64 != (RTCRayN *)0x0) &&
                                   (((pRVar65->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                                  pRVar64 = (RTCRayN *)(*(code *)pRVar64)(&args);
                                  uVar60 = local_13d0;
                                  uVar70 = local_13d8;
                                  lVar71 = local_13e0;
                                }
                                auVar48._8_8_ = uStack_13f0;
                                auVar48._0_8_ = local_13f8;
                                auVar103._0_4_ = -(uint)((int)local_13f8 == 0);
                                auVar103._4_4_ = -(uint)((int)((ulong)local_13f8 >> 0x20) == 0);
                                auVar103._8_4_ = -(uint)((int)uStack_13f0 == 0);
                                auVar103._12_4_ = -(uint)((int)((ulong)uStack_13f0 >> 0x20) == 0);
                                auVar134 = auVar103 ^ _DAT_01febe20;
                                if (auVar48 != (undefined1  [16])0x0) {
                                  auVar116 = blendvps(*(undefined1 (*) [16])args.hit,
                                                      *(undefined1 (*) [16])(args.ray + 0xc0),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                      *(undefined1 (*) [16])(args.ray + 0xd0),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                      *(undefined1 (*) [16])(args.ray + 0xe0),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                      *(undefined1 (*) [16])(args.ray + 0xf0),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                      *(undefined1 (*) [16])(args.ray + 0x100),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                      *(undefined1 (*) [16])(args.ray + 0x110),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                      *(undefined1 (*) [16])(args.ray + 0x120),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                      *(undefined1 (*) [16])(args.ray + 0x130),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                      *(undefined1 (*) [16])(args.ray + 0x140),
                                                      auVar103);
                                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar116;
                                  pRVar64 = args.ray;
                                  pRVar65 = (RTCIntersectArguments *)args.hit;
                                }
                              }
                              fVar263 = (float)uVar70;
                              if ((_DAT_01fecb20 & auVar134) == (undefined1  [16])0x0) {
                                *(undefined4 *)(pRVar57 + k * 4 + 0x80) = uVar58;
                              }
                              valid.field_0.v[lVar74] = 0.0;
                              fVar261 = *(float *)(pRVar57 + k * 4 + 0x80);
                              auVar54._4_4_ = local_12a8[1];
                              auVar54._0_4_ = local_12a8[0];
                              auVar54._8_4_ = local_12a8[2];
                              auVar54._12_4_ = local_12a8[3];
                              valid.field_0.i[0] =
                                   -(uint)(local_12a8[0] <= fVar261) & valid.field_0.i[0];
                              valid.field_0.i[1] =
                                   -(uint)(local_12a8[1] <= fVar261) & valid.field_0.i[1];
                              valid.field_0.i[2] =
                                   -(uint)(local_12a8[2] <= fVar261) & valid.field_0.i[2];
                              valid.field_0.i[3] =
                                   -(uint)(local_12a8[3] <= fVar261) & valid.field_0.i[3];
                              uVar115 = movmskps((int)pRVar64,(undefined1  [16])valid.field_0);
                              if (uVar115 != 0) {
                                auVar180 = blendvps(_DAT_01feb9f0,auVar54,
                                                    (undefined1  [16])valid.field_0);
                                auVar173._4_4_ = auVar180._0_4_;
                                auVar173._0_4_ = auVar180._4_4_;
                                auVar173._8_4_ = auVar180._12_4_;
                                auVar173._12_4_ = auVar180._8_4_;
                                auVar116 = minps(auVar173,auVar180);
                                auVar135._0_8_ = auVar116._8_8_;
                                auVar135._8_4_ = auVar116._0_4_;
                                auVar135._12_4_ = auVar116._4_4_;
                                auVar116 = minps(auVar135,auVar116);
                                auVar136._0_8_ =
                                     CONCAT44(-(uint)(auVar116._4_4_ == auVar180._4_4_) &
                                              valid.field_0.i[1],
                                              -(uint)(auVar116._0_4_ == auVar180._0_4_) &
                                              valid.field_0.i[0]);
                                auVar136._8_4_ =
                                     -(uint)(auVar116._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                                auVar136._12_4_ =
                                     -(uint)(auVar116._12_4_ == auVar180._12_4_) &
                                     valid.field_0.i[3];
                                iVar75 = movmskps((int)pRVar65,auVar136);
                                aVar104 = valid.field_0;
                                if (iVar75 != 0) {
                                  aVar104.i[2] = auVar136._8_4_;
                                  aVar104._0_8_ = auVar136._0_8_;
                                  aVar104.i[3] = auVar136._12_4_;
                                }
                                uVar58 = movmskps(iVar75,(undefined1  [16])aVar104);
                                uVar66 = CONCAT44((int)((ulong)pRVar65 >> 0x20),uVar58);
                                lVar74 = 0;
                                if (uVar66 != 0) {
                                  for (; (uVar66 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                                  }
                                }
                              }
                            } while ((char)uVar115 != '\0');
                          }
                        }
                      }
                    }
                  }
                  fVar261 = *(float *)(pRVar57 + k * 4);
                  fVar207 = *(float *)(pRVar57 + k * 4 + 0x10);
                  fVar216 = *(float *)(pRVar57 + k * 4 + 0x20);
                  fVar239 = *(float *)(pRVar57 + k * 4 + 0x40);
                  fVar244 = *(float *)(pRVar57 + k * 4 + 0x50);
                  fVar191 = fVar191 - fVar261;
                  fVar225 = fVar225 - fVar261;
                  fStack_1410 = fStack_1410 - fVar261;
                  fStack_140c = fStack_140c - fVar261;
                  fVar206 = fVar201 - fVar207;
                  fVar209 = fVar235 - fVar207;
                  fVar218 = ((fVar161 - fVar176) * fVar243 + fVar176) - fVar207;
                  fVar220 = fVar233 - fVar207;
                  local_11e8 = local_11e8 - fVar216;
                  fStack_11e4 = fStack_11e4 - fVar216;
                  fStack_11e0 = fStack_11e0 - fVar216;
                  fStack_11dc = fStack_11dc - fVar216;
                  fVar269 = local_1208 - fVar261;
                  fVar276 = fStack_1204 - fVar261;
                  fVar278 = fStack_1200 - fVar261;
                  fVar281 = fStack_11fc - fVar261;
                  fVar234 = fVar234 - fVar207;
                  fVar176 = fVar201 - fVar207;
                  fVar233 = fVar233 - fVar207;
                  fVar252 = fVar252 - fVar207;
                  fVar238 = fVar238 - fVar216;
                  fVar246 = fVar204 - fVar216;
                  fVar144 = (float)local_1438._8_4_ - fVar216;
                  fVar237 = fStack_142c - fVar216;
                  fVar283 = local_11f8 - fVar261;
                  fVar285 = fStack_11f4 - fVar261;
                  fVar287 = fStack_11f0 - fVar261;
                  fVar261 = fStack_11ec - fVar261;
                  fVar286 = fVar286 - fVar207;
                  fVar265 = fVar265 - fVar207;
                  fVar235 = fVar235 - fVar207;
                  fVar201 = fVar201 - fVar207;
                  fVar288 = fVar288 - fVar216;
                  fVar267 = fVar267 - fVar216;
                  fVar240 = fVar240 - fVar216;
                  fVar204 = fVar204 - fVar216;
                  fVar161 = fVar283 - fVar191;
                  fVar256 = fVar285 - fVar225;
                  fVar223 = fVar287 - fStack_1410;
                  fVar260 = fVar261 - fStack_140c;
                  fVar257 = fVar286 - fVar206;
                  fVar259 = fVar265 - fVar209;
                  fVar190 = fVar235 - fVar218;
                  fVar202 = fVar201 - fVar220;
                  fVar247 = fVar288 - local_11e8;
                  fVar249 = fVar267 - fStack_11e4;
                  fStack_11f0 = fVar240 - fStack_11e0;
                  fStack_11ec = fVar204 - fStack_11dc;
                  _local_11f8 = CONCAT44(fVar249,fVar247);
                  fVar243 = *(float *)(pRVar57 + k * 4 + 0x60);
                  local_1438._4_4_ = fVar243;
                  local_1438._0_4_ = fVar243;
                  local_1438._8_4_ = fVar243;
                  fStack_142c = fVar243;
                  fVar245 = fVar191 - fVar269;
                  fVar264 = fVar225 - fVar276;
                  fVar266 = fStack_1410 - fVar278;
                  fVar268 = fStack_140c - fVar281;
                  fVar258 = fVar206 - fVar234;
                  fVar262 = fVar209 - fVar176;
                  fVar284 = fVar218 - fVar233;
                  fVar205 = fVar220 - fVar252;
                  fVar222 = (fVar257 * (fVar288 + local_11e8) - (fVar286 + fVar206) * fVar247) *
                            fVar239 + ((fVar283 + fVar191) * fVar247 -
                                      (fVar288 + local_11e8) * fVar161) * fVar244 +
                                      (fVar161 * (fVar286 + fVar206) - (fVar283 + fVar191) * fVar257
                                      ) * fVar243;
                  fVar226 = (fVar259 * (fVar267 + fStack_11e4) - (fVar265 + fVar209) * fVar249) *
                            fVar239 + ((fVar285 + fVar225) * fVar249 -
                                      (fVar267 + fStack_11e4) * fVar256) * fVar244 +
                                      (fVar256 * (fVar265 + fVar209) - (fVar285 + fVar225) * fVar259
                                      ) * fVar243;
                  fVar236 = (fVar190 * (fVar240 + fStack_11e0) - (fVar235 + fVar218) * fStack_11f0)
                            * fVar239 +
                            ((fVar287 + fStack_1410) * fStack_11f0 -
                            (fVar240 + fStack_11e0) * fVar223) * fVar244 +
                            (fVar223 * (fVar235 + fVar218) - (fVar287 + fStack_1410) * fVar190) *
                            fVar243;
                  fVar241 = (fVar202 * (fVar204 + fStack_11dc) - (fVar201 + fVar220) * fStack_11ec)
                            * fVar239 +
                            ((fVar261 + fStack_140c) * fStack_11ec -
                            (fVar204 + fStack_11dc) * fVar260) * fVar244 +
                            (fVar260 * (fVar201 + fVar220) - (fVar261 + fStack_140c) * fVar202) *
                            fVar243;
                  local_1208 = local_11e8 - fVar238;
                  fStack_1204 = fStack_11e4 - fVar246;
                  fStack_1200 = fStack_11e0 - fVar144;
                  fStack_11fc = fStack_11dc - fVar237;
                  local_1218._0_4_ =
                       (fVar258 * (local_11e8 + fVar238) - (fVar206 + fVar234) * local_1208) *
                       fVar239 + ((fVar191 + fVar269) * local_1208 -
                                 (local_11e8 + fVar238) * fVar245) * fVar244 +
                                 (fVar245 * (fVar206 + fVar234) - (fVar191 + fVar269) * fVar258) *
                                 fVar243;
                  local_1218._4_4_ =
                       (fVar262 * (fStack_11e4 + fVar246) - (fVar209 + fVar176) * fStack_1204) *
                       fVar239 + ((fVar225 + fVar276) * fStack_1204 -
                                 (fStack_11e4 + fVar246) * fVar264) * fVar244 +
                                 (fVar264 * (fVar209 + fVar176) - (fVar225 + fVar276) * fVar262) *
                                 fVar243;
                  fStack_1210 = (fVar284 * (fStack_11e0 + fVar144) -
                                (fVar218 + fVar233) * fStack_1200) * fVar239 +
                                ((fStack_1410 + fVar278) * fStack_1200 -
                                (fStack_11e0 + fVar144) * fVar266) * fVar244 +
                                (fVar266 * (fVar218 + fVar233) - (fStack_1410 + fVar278) * fVar284)
                                * fVar243;
                  fStack_120c = (fVar205 * (fStack_11dc + fVar237) -
                                (fVar220 + fVar252) * fStack_11fc) * fVar239 +
                                ((fStack_140c + fVar281) * fStack_11fc -
                                (fStack_11dc + fVar237) * fVar268) * fVar244 +
                                (fVar268 * (fVar220 + fVar252) - (fStack_140c + fVar281) * fVar205)
                                * fVar243;
                  fVar248 = fVar269 - fVar283;
                  fVar253 = fVar276 - fVar285;
                  fVar254 = fVar278 - fVar287;
                  fVar255 = fVar281 - fVar261;
                  fVar200 = fVar234 - fVar286;
                  fVar203 = fVar176 - fVar265;
                  fVar242 = fVar233 - fVar235;
                  fVar224 = fVar252 - fVar201;
                  fVar275 = fVar238 - fVar288;
                  fVar277 = fVar246 - fVar267;
                  fVar279 = fVar144 - fVar240;
                  fVar282 = fVar237 - fVar204;
                  auVar98._0_4_ =
                       (fVar200 * (fVar288 + fVar238) - (fVar286 + fVar234) * fVar275) * fVar239 +
                       ((fVar283 + fVar269) * fVar275 - (fVar288 + fVar238) * fVar248) * fVar244 +
                       (fVar248 * (fVar286 + fVar234) - (fVar283 + fVar269) * fVar200) * fVar243;
                  auVar98._4_4_ =
                       (fVar203 * (fVar267 + fVar246) - (fVar265 + fVar176) * fVar277) * fVar239 +
                       ((fVar285 + fVar276) * fVar277 - (fVar267 + fVar246) * fVar253) * fVar244 +
                       (fVar253 * (fVar265 + fVar176) - (fVar285 + fVar276) * fVar203) * fVar243;
                  auVar98._8_4_ =
                       (fVar242 * (fVar240 + fVar144) - (fVar235 + fVar233) * fVar279) * fVar239 +
                       ((fVar287 + fVar278) * fVar279 - (fVar240 + fVar144) * fVar254) * fVar244 +
                       (fVar254 * (fVar235 + fVar233) - (fVar287 + fVar278) * fVar242) * fVar243;
                  auVar98._12_4_ =
                       (fVar224 * (fVar204 + fVar237) - (fVar201 + fVar252) * fVar282) * fVar239 +
                       ((fVar261 + fVar281) * fVar282 - (fVar204 + fVar237) * fVar255) * fVar244 +
                       (fVar255 * (fVar201 + fVar252) - (fVar261 + fVar281) * fVar224) * fVar243;
                  auVar152._0_4_ = fVar222 + (float)local_1218._0_4_ + auVar98._0_4_;
                  auVar152._4_4_ = fVar226 + (float)local_1218._4_4_ + auVar98._4_4_;
                  auVar152._8_4_ = fVar236 + fStack_1210 + auVar98._8_4_;
                  auVar152._12_4_ = fVar241 + fStack_120c + auVar98._12_4_;
                  auVar127._8_4_ = fVar236;
                  auVar127._0_8_ = CONCAT44(fVar226,fVar222);
                  auVar127._12_4_ = fVar241;
                  auVar116 = minps(auVar127,_local_1218);
                  auVar116 = minps(auVar116,auVar98);
                  auVar271._8_4_ = fVar236;
                  auVar271._0_8_ = CONCAT44(fVar226,fVar222);
                  auVar271._12_4_ = fVar241;
                  auVar180 = maxps(auVar271,_local_1218);
                  auVar180 = maxps(auVar180,auVar98);
                  fVar261 = ABS(auVar152._0_4_) * 1.1920929e-07;
                  fVar207 = ABS(auVar152._4_4_) * 1.1920929e-07;
                  fVar216 = ABS(auVar152._8_4_) * 1.1920929e-07;
                  fVar176 = ABS(auVar152._12_4_) * 1.1920929e-07;
                  auVar272._4_4_ = -(uint)(auVar180._4_4_ <= fVar207);
                  auVar272._0_4_ = -(uint)(auVar180._0_4_ <= fVar261);
                  auVar272._8_4_ = -(uint)(auVar180._8_4_ <= fVar216);
                  auVar272._12_4_ = -(uint)(auVar180._12_4_ <= fVar176);
                  auVar128._4_4_ = -(uint)(-fVar207 <= auVar116._4_4_);
                  auVar128._0_4_ = -(uint)(-fVar261 <= auVar116._0_4_);
                  auVar128._8_4_ = -(uint)(-fVar216 <= auVar116._8_4_);
                  auVar128._12_4_ = -(uint)(-fVar176 <= auVar116._12_4_);
                  auVar272 = auVar272 | auVar128;
                  iVar75 = movmskps(uVar115,auVar272);
                  ray = pRVar57;
                  if (iVar75 != 0) {
                    auVar170._0_4_ = fVar258 * fVar275 - fVar200 * local_1208;
                    auVar170._4_4_ = fVar262 * fVar277 - fVar203 * fStack_1204;
                    auVar170._8_4_ = fVar284 * fVar279 - fVar242 * fStack_1200;
                    auVar170._12_4_ = fVar205 * fVar282 - fVar224 * fStack_11fc;
                    auVar99._4_4_ = -(uint)(ABS(fVar262 * fVar249) < ABS(fVar203 * fStack_1204));
                    auVar99._0_4_ = -(uint)(ABS(fVar258 * fVar247) < ABS(fVar200 * local_1208));
                    auVar99._8_4_ = -(uint)(ABS(fVar284 * fStack_11f0) < ABS(fVar242 * fStack_1200))
                    ;
                    auVar99._12_4_ =
                         -(uint)(ABS(fVar205 * fStack_11ec) < ABS(fVar224 * fStack_11fc));
                    auVar39._4_4_ = fVar259 * fStack_1204 - fVar262 * fVar249;
                    auVar39._0_4_ = fVar257 * local_1208 - fVar258 * fVar247;
                    auVar39._8_4_ = fVar190 * fStack_1200 - fVar284 * fStack_11f0;
                    auVar39._12_4_ = fVar202 * fStack_11fc - fVar205 * fStack_11ec;
                    local_1298 = blendvps(auVar170,auVar39,auVar99);
                    auVar274._0_4_ = fVar247 * fVar245 - fVar161 * local_1208;
                    auVar274._4_4_ = fVar249 * fVar264 - fVar256 * fStack_1204;
                    auVar274._8_4_ = fStack_11f0 * fVar266 - fVar223 * fStack_1200;
                    auVar274._12_4_ = fStack_11ec * fVar268 - fVar260 * fStack_11fc;
                    auVar199._0_4_ = fVar248 * local_1208 - fVar245 * fVar275;
                    auVar199._4_4_ = fVar253 * fStack_1204 - fVar264 * fVar277;
                    auVar199._8_4_ = fVar254 * fStack_1200 - fVar266 * fVar279;
                    auVar199._12_4_ = fVar255 * fStack_11fc - fVar268 * fVar282;
                    auVar100._4_4_ = -(uint)(ABS(fVar256 * fStack_1204) < ABS(fVar264 * fVar277));
                    auVar100._0_4_ = -(uint)(ABS(fVar161 * local_1208) < ABS(fVar245 * fVar275));
                    auVar100._8_4_ = -(uint)(ABS(fVar223 * fStack_1200) < ABS(fVar266 * fVar279));
                    auVar100._12_4_ = -(uint)(ABS(fVar260 * fStack_11fc) < ABS(fVar268 * fVar282));
                    local_1288 = blendvps(auVar199,auVar274,auVar100);
                    auVar189._0_4_ = fVar161 * fVar258 - fVar245 * fVar257;
                    auVar189._4_4_ = fVar256 * fVar262 - fVar264 * fVar259;
                    auVar189._8_4_ = fVar223 * fVar284 - fVar266 * fVar190;
                    auVar189._12_4_ = fVar260 * fVar205 - fVar268 * fVar202;
                    auVar213._0_4_ = fVar245 * fVar200 - fVar248 * fVar258;
                    auVar213._4_4_ = fVar264 * fVar203 - fVar253 * fVar262;
                    auVar213._8_4_ = fVar266 * fVar242 - fVar254 * fVar284;
                    auVar213._12_4_ = fVar268 * fVar224 - fVar255 * fVar205;
                    auVar101._4_4_ = -(uint)(ABS(fVar264 * fVar259) < ABS(fVar253 * fVar262));
                    auVar101._0_4_ = -(uint)(ABS(fVar245 * fVar257) < ABS(fVar248 * fVar258));
                    auVar101._8_4_ = -(uint)(ABS(fVar266 * fVar190) < ABS(fVar254 * fVar284));
                    auVar101._12_4_ = -(uint)(ABS(fVar268 * fVar202) < ABS(fVar255 * fVar205));
                    local_1278 = blendvps(auVar213,auVar189,auVar101);
                    fVar261 = fVar239 * local_1298._0_4_ +
                              fVar244 * local_1288._0_4_ + fVar243 * local_1278._0_4_;
                    fVar207 = fVar239 * local_1298._4_4_ +
                              fVar244 * local_1288._4_4_ + fVar243 * local_1278._4_4_;
                    fVar216 = fVar239 * local_1298._8_4_ +
                              fVar244 * local_1288._8_4_ + fVar243 * local_1278._8_4_;
                    fVar243 = fVar239 * local_1298._12_4_ +
                              fVar244 * local_1288._12_4_ + fVar243 * local_1278._12_4_;
                    auVar251._0_4_ = fVar261 + fVar261;
                    auVar251._4_4_ = fVar207 + fVar207;
                    auVar251._8_4_ = fVar216 + fVar216;
                    auVar251._12_4_ = fVar243 + fVar243;
                    auVar129._0_4_ = local_11e8 * local_1278._0_4_;
                    auVar129._4_4_ = fStack_11e4 * local_1278._4_4_;
                    auVar129._8_4_ = fStack_11e0 * local_1278._8_4_;
                    auVar129._12_4_ = fStack_11dc * local_1278._12_4_;
                    fVar239 = fVar191 * local_1298._0_4_ +
                              fVar206 * local_1288._0_4_ + auVar129._0_4_;
                    fVar244 = fVar225 * local_1298._4_4_ +
                              fVar209 * local_1288._4_4_ + auVar129._4_4_;
                    fVar176 = fStack_1410 * local_1298._8_4_ +
                              fVar218 * local_1288._8_4_ + auVar129._8_4_;
                    fVar161 = fStack_140c * local_1298._12_4_ +
                              fVar220 * local_1288._12_4_ + auVar129._12_4_;
                    auVar116 = rcpps(auVar129,auVar251);
                    fVar261 = auVar116._0_4_;
                    fVar243 = auVar116._4_4_;
                    fVar207 = auVar116._8_4_;
                    fVar216 = auVar116._12_4_;
                    local_12a8[0] =
                         ((1.0 - auVar251._0_4_ * fVar261) * fVar261 + fVar261) *
                         (fVar239 + fVar239);
                    local_12a8[1] =
                         ((1.0 - auVar251._4_4_ * fVar243) * fVar243 + fVar243) *
                         (fVar244 + fVar244);
                    local_12a8[2] =
                         ((1.0 - auVar251._8_4_ * fVar207) * fVar207 + fVar207) *
                         (fVar176 + fVar176);
                    local_12a8[3] =
                         ((1.0 - auVar251._12_4_ * fVar216) * fVar216 + fVar216) *
                         (fVar161 + fVar161);
                    fVar261 = *(float *)(pRVar57 + k * 4 + 0x80);
                    fVar243 = *(float *)(pRVar57 + k * 4 + 0x30);
                    iVar76 = -(uint)(fVar243 <= local_12a8[1]);
                    iVar77 = -(uint)(fVar243 <= local_12a8[2]);
                    iVar78 = -(uint)(fVar243 <= local_12a8[3]);
                    auVar153._8_4_ = iVar77;
                    auVar153._4_4_ = iVar76;
                    auVar153._12_4_ = iVar78;
                    auVar130._0_4_ =
                         -(uint)(local_12a8[0] <= fVar261 && fVar243 <= local_12a8[0]) &
                         auVar272._0_4_;
                    auVar130._4_4_ =
                         -(uint)(local_12a8[1] <= fVar261 && fVar243 <= local_12a8[1]) &
                         auVar272._4_4_;
                    auVar130._8_4_ =
                         -(uint)(local_12a8[2] <= fVar261 && fVar243 <= local_12a8[2]) &
                         auVar272._8_4_;
                    auVar130._12_4_ =
                         -(uint)(local_12a8[3] <= fVar261 && fVar243 <= local_12a8[3]) &
                         auVar272._12_4_;
                    iVar75 = movmskps(iVar75,auVar130);
                    if (iVar75 != 0) {
                      valid.field_0.i[0] = auVar130._0_4_ & -(uint)(auVar251._0_4_ != 0.0);
                      valid.field_0.i[1] = auVar130._4_4_ & -(uint)(auVar251._4_4_ != 0.0);
                      valid.field_0.i[2] = auVar130._8_4_ & -(uint)(auVar251._8_4_ != 0.0);
                      valid.field_0.i[3] = auVar130._12_4_ & -(uint)(auVar251._12_4_ != 0.0);
                      iVar75 = movmskps(iVar75,(undefined1  [16])valid.field_0);
                      if (iVar75 != 0) {
                        auVar153._0_4_ = (float)(int)(*(ushort *)(lVar71 + 8 + lVar61) - 1);
                        auVar214._4_4_ = iVar76;
                        auVar214._0_4_ = auVar153._0_4_;
                        auVar214._8_4_ = iVar77;
                        auVar214._12_4_ = iVar78;
                        auVar116 = rcpss(auVar214,auVar153);
                        fVar261 = (2.0 - auVar153._0_4_ * auVar116._0_4_) * auVar116._0_4_;
                        auVar215._4_12_ = auVar116._4_12_;
                        auVar215._0_4_ = (float)(int)(*(ushort *)(lVar71 + 10 + lVar61) - 1);
                        auVar232._4_4_ = auVar116._4_4_;
                        auVar232._0_4_ = auVar215._0_4_;
                        auVar232._8_4_ = auVar116._8_4_;
                        auVar232._12_4_ = auVar116._12_4_;
                        auVar116 = rcpss(auVar232,auVar215);
                        fVar243 = (2.0 - auVar215._0_4_ * auVar116._0_4_) * auVar116._0_4_;
                        tNear.field_0.v[0] =
                             fVar261 * ((float)(int)local_1258._0_4_ * auVar152._0_4_ +
                                       (auVar152._0_4_ - fVar222));
                        tNear.field_0.v[1] =
                             fVar261 * ((float)(local_1258._0_4_ + 1) * auVar152._4_4_ +
                                       (auVar152._4_4_ - fVar226));
                        tNear.field_0.v[2] =
                             fVar261 * ((float)(local_1258._0_4_ + 1) * auVar152._8_4_ +
                                       (auVar152._8_4_ - fVar236));
                        tNear.field_0.v[3] =
                             fVar261 * ((float)(int)local_1258._0_4_ * auVar152._12_4_ +
                                       (auVar152._12_4_ - fVar241));
                        auVar171._0_4_ =
                             (float)(int)local_1268._0_4_ * auVar152._0_4_ +
                             (auVar152._0_4_ - (float)local_1218._0_4_);
                        auVar171._4_4_ =
                             (float)(int)local_1268._0_4_ * auVar152._4_4_ +
                             (auVar152._4_4_ - (float)local_1218._4_4_);
                        auVar171._8_4_ =
                             (float)(local_1268._0_4_ + 1) * auVar152._8_4_ +
                             (auVar152._8_4_ - fStack_1210);
                        auVar171._12_4_ =
                             (float)(local_1268._0_4_ + 1) * auVar152._12_4_ +
                             (auVar152._12_4_ - fStack_120c);
                        pGVar22 = (context->scene->geometries).items[uVar60].ptr;
                        if ((pGVar22->mask & *(uint *)(pRVar57 + k * 4 + 0x90)) != 0) {
                          auVar116 = rcpps(auVar171,auVar152);
                          fVar261 = auVar116._0_4_;
                          fVar207 = auVar116._4_4_;
                          fVar216 = auVar116._8_4_;
                          fVar239 = auVar116._12_4_;
                          fVar261 = (float)(-(uint)(1e-18 <= ABS(auVar152._0_4_)) &
                                           (uint)(((float)DAT_01feca10 - auVar152._0_4_ * fVar261) *
                                                  fVar261 + fVar261));
                          fVar207 = (float)(-(uint)(1e-18 <= ABS(auVar152._4_4_)) &
                                           (uint)((DAT_01feca10._4_4_ - auVar152._4_4_ * fVar207) *
                                                  fVar207 + fVar207));
                          fVar216 = (float)(-(uint)(1e-18 <= ABS(auVar152._8_4_)) &
                                           (uint)((DAT_01feca10._8_4_ - auVar152._8_4_ * fVar216) *
                                                  fVar216 + fVar216));
                          fVar239 = (float)(-(uint)(1e-18 <= ABS(auVar152._12_4_)) &
                                           (uint)((DAT_01feca10._12_4_ - auVar152._12_4_ * fVar239)
                                                  * fVar239 + fVar239));
                          auVar131._0_4_ = tNear.field_0.v[0] * fVar261;
                          auVar131._4_4_ = tNear.field_0.v[1] * fVar207;
                          auVar131._8_4_ = tNear.field_0.v[2] * fVar216;
                          auVar131._12_4_ = tNear.field_0.v[3] * fVar239;
                          local_12c8 = minps(auVar131,_DAT_01feca10);
                          auVar154._0_4_ = fVar243 * auVar171._0_4_ * fVar261;
                          auVar154._4_4_ = fVar243 * auVar171._4_4_ * fVar207;
                          auVar154._8_4_ = fVar243 * auVar171._8_4_ * fVar216;
                          auVar154._12_4_ = fVar243 * auVar171._12_4_ * fVar239;
                          local_12b8 = minps(auVar154,_DAT_01feca10);
                          auVar53._4_4_ = local_12a8[1];
                          auVar53._0_4_ = local_12a8[0];
                          auVar53._8_4_ = local_12a8[2];
                          auVar53._12_4_ = local_12a8[3];
                          auVar180 = blendvps(_DAT_01feb9f0,auVar53,(undefined1  [16])valid.field_0)
                          ;
                          auVar172._4_4_ = auVar180._0_4_;
                          auVar172._0_4_ = auVar180._4_4_;
                          auVar172._8_4_ = auVar180._12_4_;
                          auVar172._12_4_ = auVar180._8_4_;
                          auVar116 = minps(auVar172,auVar180);
                          auVar132._0_8_ = auVar116._8_8_;
                          auVar132._8_4_ = auVar116._0_4_;
                          auVar132._12_4_ = auVar116._4_4_;
                          auVar116 = minps(auVar132,auVar116);
                          auVar133._0_8_ =
                               CONCAT44(-(uint)(auVar116._4_4_ == auVar180._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar116._0_4_ == auVar180._0_4_) &
                                        valid.field_0.i[0]);
                          auVar133._8_4_ =
                               -(uint)(auVar116._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                          auVar133._12_4_ =
                               -(uint)(auVar116._12_4_ == auVar180._12_4_) & valid.field_0.i[3];
                          iVar75 = movmskps(*(uint *)(pRVar57 + k * 4 + 0x90),auVar133);
                          aVar102 = valid.field_0;
                          if (iVar75 != 0) {
                            aVar102.i[2] = auVar133._8_4_;
                            aVar102._0_8_ = auVar133._0_8_;
                            aVar102.i[3] = auVar133._12_4_;
                          }
                          uVar115 = movmskps(iVar75,(undefined1  [16])aVar102);
                          lVar74 = 0;
                          if (uVar115 != 0) {
                            for (; (uVar115 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                            }
                          }
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar58 = *(undefined4 *)(local_12c8 + lVar74 * 4);
                            fVar261 = local_12a8[lVar74 + -4];
                            uVar16 = *(undefined4 *)(local_1298 + lVar74 * 4);
                            uVar17 = *(undefined4 *)(local_1288 + lVar74 * 4);
                            uVar20 = *(undefined4 *)(local_1278 + lVar74 * 4);
                            *(float *)(pRVar57 + k * 4 + 0x80) = local_12a8[lVar74];
                            *(undefined4 *)(pRVar57 + k * 4 + 0xc0) = uVar16;
                            *(undefined4 *)(pRVar57 + k * 4 + 0xd0) = uVar17;
                            *(undefined4 *)(pRVar57 + k * 4 + 0xe0) = uVar20;
                            *(undefined4 *)(pRVar57 + k * 4 + 0xf0) = uVar58;
                            *(float *)(pRVar57 + k * 4 + 0x100) = fVar261;
                            *(float *)(pRVar57 + k * 4 + 0x110) = fVar263;
                            *(int *)(pRVar57 + k * 4 + 0x120) = (int)uVar60;
                            *(uint *)(pRVar57 + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(pRVar57 + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_1448 = CONCAT44((uint)uStack_1440,(uint)uStack_1440);
                            uStack_1440._4_4_ = (uint)uStack_1440;
                            local_1418 = CONCAT44(fVar114,fVar114);
                            uVar21 = *(undefined8 *)(mm_lookupmask_ps + lVar59);
                            uVar46 = *(undefined8 *)(mm_lookupmask_ps + lVar59 + 8);
                            do {
                              uVar58 = *(undefined4 *)(pRVar57 + k * 4 + 0x80);
                              local_1438._0_4_ = uVar58;
                              local_1098 = *(undefined4 *)(local_12c8 + lVar74 * 4);
                              local_1088 = local_12a8[lVar74 + -4];
                              *(float *)(pRVar57 + k * 4 + 0x80) = local_12a8[lVar74];
                              args.context = context->user;
                              local_10c8 = *(undefined4 *)(local_1298 + lVar74 * 4);
                              uVar16 = *(undefined4 *)(local_1288 + lVar74 * 4);
                              uVar17 = *(undefined4 *)(local_1278 + lVar74 * 4);
                              local_10b8._4_4_ = uVar16;
                              local_10b8._0_4_ = uVar16;
                              local_10b8._8_4_ = uVar16;
                              local_10b8._12_4_ = uVar16;
                              local_10a8._4_4_ = uVar17;
                              local_10a8._0_4_ = uVar17;
                              local_10a8._8_4_ = uVar17;
                              local_10a8._12_4_ = uVar17;
                              uStack_10c4 = local_10c8;
                              uStack_10c0 = local_10c8;
                              uStack_10bc = local_10c8;
                              uStack_1094 = local_1098;
                              uStack_1090 = local_1098;
                              uStack_108c = local_1098;
                              fStack_1084 = local_1088;
                              fStack_1080 = local_1088;
                              fStack_107c = local_1088;
                              local_1078 = local_1418;
                              uStack_1070 = CONCAT44(fVar114,fVar114);
                              local_1068 = local_1448;
                              uStack_1060 = uStack_1440;
                              local_1058 = (args.context)->instID[0];
                              uStack_1054 = local_1058;
                              uStack_1050 = local_1058;
                              uStack_104c = local_1058;
                              local_1048 = (args.context)->instPrimID[0];
                              uStack_1044 = local_1048;
                              uStack_1040 = local_1048;
                              uStack_103c = local_1048;
                              args.valid = (int *)&local_13f8;
                              pRVar65 = (RTCIntersectArguments *)pGVar22->userPtr;
                              args.ray = (RTCRayN *)pRVar57;
                              args.hit = (RTCHitN *)&local_10c8;
                              args.N = 4;
                              pRVar64 = (RTCRayN *)pGVar22->intersectionFilterN;
                              local_13f8 = uVar21;
                              uStack_13f0 = uVar46;
                              args.geometryUserPtr = pRVar65;
                              if (pRVar64 != (RTCRayN *)0x0) {
                                pRVar64 = (RTCRayN *)(*(code *)pRVar64)(&args);
                              }
                              auVar49._8_8_ = uStack_13f0;
                              auVar49._0_8_ = local_13f8;
                              if (auVar49 == (undefined1  [16])0x0) {
                                auVar137._8_4_ = 0xffffffff;
                                auVar137._0_8_ = 0xffffffffffffffff;
                                auVar137._12_4_ = 0xffffffff;
                                auVar137 = auVar137 ^ _DAT_01febe20;
                              }
                              else {
                                pRVar65 = context->args;
                                pRVar64 = (RTCRayN *)pRVar65->filter;
                                if ((pRVar64 != (RTCRayN *)0x0) &&
                                   (((pRVar65->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                                  pRVar64 = (RTCRayN *)(*(code *)pRVar64)(&args);
                                }
                                auVar50._8_8_ = uStack_13f0;
                                auVar50._0_8_ = local_13f8;
                                auVar105._0_4_ = -(uint)((int)local_13f8 == 0);
                                auVar105._4_4_ = -(uint)((int)((ulong)local_13f8 >> 0x20) == 0);
                                auVar105._8_4_ = -(uint)((int)uStack_13f0 == 0);
                                auVar105._12_4_ = -(uint)((int)((ulong)uStack_13f0 >> 0x20) == 0);
                                auVar137 = auVar105 ^ _DAT_01febe20;
                                if (auVar50 != (undefined1  [16])0x0) {
                                  auVar116 = blendvps(*(undefined1 (*) [16])args.hit,
                                                      *(undefined1 (*) [16])(args.ray + 0xc0),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                      *(undefined1 (*) [16])(args.ray + 0xd0),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                      *(undefined1 (*) [16])(args.ray + 0xe0),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                      *(undefined1 (*) [16])(args.ray + 0xf0),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                      *(undefined1 (*) [16])(args.ray + 0x100),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                      *(undefined1 (*) [16])(args.ray + 0x110),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                      *(undefined1 (*) [16])(args.ray + 0x120),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                      *(undefined1 (*) [16])(args.ray + 0x130),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar116;
                                  auVar116 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                      *(undefined1 (*) [16])(args.ray + 0x140),
                                                      auVar105);
                                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar116;
                                  pRVar64 = args.ray;
                                  pRVar65 = (RTCIntersectArguments *)args.hit;
                                }
                              }
                              if ((_DAT_01fecb20 & auVar137) == (undefined1  [16])0x0) {
                                *(undefined4 *)(pRVar57 + k * 4 + 0x80) = uVar58;
                              }
                              valid.field_0.v[lVar74] = 0.0;
                              fVar261 = *(float *)(pRVar57 + k * 4 + 0x80);
                              auVar55._4_4_ = local_12a8[1];
                              auVar55._0_4_ = local_12a8[0];
                              auVar55._8_4_ = local_12a8[2];
                              auVar55._12_4_ = local_12a8[3];
                              valid.field_0.i[0] =
                                   -(uint)(local_12a8[0] <= fVar261) & valid.field_0.i[0];
                              valid.field_0.i[1] =
                                   -(uint)(local_12a8[1] <= fVar261) & valid.field_0.i[1];
                              valid.field_0.i[2] =
                                   -(uint)(local_12a8[2] <= fVar261) & valid.field_0.i[2];
                              valid.field_0.i[3] =
                                   -(uint)(local_12a8[3] <= fVar261) & valid.field_0.i[3];
                              iVar75 = movmskps((int)pRVar64,(undefined1  [16])valid.field_0);
                              if (iVar75 != 0) {
                                auVar180 = blendvps(_DAT_01feb9f0,auVar55,
                                                    (undefined1  [16])valid.field_0);
                                auVar174._4_4_ = auVar180._0_4_;
                                auVar174._0_4_ = auVar180._4_4_;
                                auVar174._8_4_ = auVar180._12_4_;
                                auVar174._12_4_ = auVar180._8_4_;
                                auVar116 = minps(auVar174,auVar180);
                                auVar138._0_8_ = auVar116._8_8_;
                                auVar138._8_4_ = auVar116._0_4_;
                                auVar138._12_4_ = auVar116._4_4_;
                                auVar116 = minps(auVar138,auVar116);
                                auVar139._0_8_ =
                                     CONCAT44(-(uint)(auVar116._4_4_ == auVar180._4_4_) &
                                              valid.field_0.i[1],
                                              -(uint)(auVar116._0_4_ == auVar180._0_4_) &
                                              valid.field_0.i[0]);
                                auVar139._8_4_ =
                                     -(uint)(auVar116._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                                auVar139._12_4_ =
                                     -(uint)(auVar116._12_4_ == auVar180._12_4_) &
                                     valid.field_0.i[3];
                                iVar76 = movmskps((int)pRVar65,auVar139);
                                aVar106 = valid.field_0;
                                if (iVar76 != 0) {
                                  aVar106.i[2] = auVar139._8_4_;
                                  aVar106._0_8_ = auVar139._0_8_;
                                  aVar106.i[3] = auVar139._12_4_;
                                }
                                uVar58 = movmskps(iVar76,(undefined1  [16])aVar106);
                                uVar60 = CONCAT44((int)((ulong)pRVar65 >> 0x20),uVar58);
                                lVar74 = 0;
                                if (uVar60 != 0) {
                                  for (; (uVar60 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                                  }
                                }
                              }
                              fStack_1410 = fVar114;
                              fStack_140c = fVar114;
                            } while ((char)iVar75 != '\0');
                          }
                        }
                      }
                    }
                  }
                }
                local_1170 = local_1170 & local_1170 - 1;
              } while (local_1170 != 0);
            }
            local_1198 = local_1198 + 1;
          } while (local_1198 != local_11d0);
        }
        local_1228 = *(int *)(ray + k * 4 + 0x80);
        iStack_1224 = local_1228;
        iStack_1220 = local_1228;
        iStack_121c = local_1228;
        fVar176 = fStack_115c;
        fVar161 = fStack_1160;
        fVar246 = fStack_1164;
        fVar252 = local_1168;
        fVar256 = fStack_114c;
        fVar144 = fStack_1150;
        fVar223 = fStack_1154;
        fVar233 = local_1158;
        fVar244 = fStack_123c;
        fVar239 = fStack_1240;
        fVar216 = fStack_1244;
        fVar207 = local_1248;
        fVar114 = fStack_122c;
        fVar263 = fStack_1230;
        fVar243 = fStack_1234;
        fVar261 = local_1238;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }